

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  ulong uVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  byte bVar83;
  ulong uVar84;
  uint uVar85;
  uint uVar86;
  int iVar87;
  ulong uVar88;
  uint uVar89;
  long lVar90;
  Geometry *pGVar91;
  ulong uVar92;
  byte bVar93;
  float fVar94;
  float fVar95;
  float fVar149;
  float fVar151;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar105 [16];
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar155;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined4 uVar158;
  float fVar173;
  float fVar174;
  vint4 bi_2;
  undefined1 auVar159 [16];
  float fVar175;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  vint4 bi_1;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  float fVar179;
  vint4 bi;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar202;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  vint4 ai_2;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  vint4 ai;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  vint4 ai_1;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  RTCFilterFunctionNArguments local_880;
  undefined1 (*local_850) [32];
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar237 [64];
  
  PVar8 = prim[1];
  uVar88 = (ulong)(byte)PVar8;
  fVar179 = *(float *)(prim + uVar88 * 0x19 + 0x12);
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar98 = vsubps_avx(auVar98,*(undefined1 (*) [16])(prim + uVar88 * 0x19 + 6));
  auVar187._0_4_ = fVar179 * auVar98._0_4_;
  auVar187._4_4_ = fVar179 * auVar98._4_4_;
  auVar187._8_4_ = fVar179 * auVar98._8_4_;
  auVar187._12_4_ = fVar179 * auVar98._12_4_;
  auVar159._0_4_ = fVar179 * auVar96._0_4_;
  auVar159._4_4_ = fVar179 * auVar96._4_4_;
  auVar159._8_4_ = fVar179 * auVar96._8_4_;
  auVar159._12_4_ = fVar179 * auVar96._12_4_;
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 4 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 5 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 6 + 6)));
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 * 0xb + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar88 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  uVar92 = (ulong)(uint)((int)(uVar88 * 9) * 2);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 + uVar88 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  uVar84 = (ulong)(uint)((int)(uVar88 * 5) << 2);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar230._4_4_ = auVar159._0_4_;
  auVar230._0_4_ = auVar159._0_4_;
  auVar230._8_4_ = auVar159._0_4_;
  auVar230._12_4_ = auVar159._0_4_;
  auVar103 = vshufps_avx(auVar159,auVar159,0x55);
  auVar97 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar179 = auVar97._0_4_;
  auVar105._0_4_ = fVar179 * auVar104._0_4_;
  fVar173 = auVar97._4_4_;
  auVar105._4_4_ = fVar173 * auVar104._4_4_;
  fVar174 = auVar97._8_4_;
  auVar105._8_4_ = fVar174 * auVar104._8_4_;
  fVar175 = auVar97._12_4_;
  auVar105._12_4_ = fVar175 * auVar104._12_4_;
  auVar101._0_4_ = auVar27._0_4_ * fVar179;
  auVar101._4_4_ = auVar27._4_4_ * fVar173;
  auVar101._8_4_ = auVar27._8_4_ * fVar174;
  auVar101._12_4_ = auVar27._12_4_ * fVar175;
  auVar160._0_4_ = auVar30._0_4_ * fVar179;
  auVar160._4_4_ = auVar30._4_4_ * fVar173;
  auVar160._8_4_ = auVar30._8_4_ * fVar174;
  auVar160._12_4_ = auVar30._12_4_ * fVar175;
  auVar97 = vfmadd231ps_fma(auVar105,auVar103,auVar96);
  auVar102 = vfmadd231ps_fma(auVar101,auVar103,auVar26);
  auVar103 = vfmadd231ps_fma(auVar160,auVar29,auVar103);
  auVar99 = vfmadd231ps_fma(auVar97,auVar230,auVar98);
  auVar102 = vfmadd231ps_fma(auVar102,auVar230,auVar161);
  auVar159 = vfmadd231ps_fma(auVar103,auVar28,auVar230);
  auVar231._4_4_ = auVar187._0_4_;
  auVar231._0_4_ = auVar187._0_4_;
  auVar231._8_4_ = auVar187._0_4_;
  auVar231._12_4_ = auVar187._0_4_;
  auVar103 = vshufps_avx(auVar187,auVar187,0x55);
  auVar97 = vshufps_avx(auVar187,auVar187,0xaa);
  fVar179 = auVar97._0_4_;
  auVar232._0_4_ = fVar179 * auVar104._0_4_;
  fVar173 = auVar97._4_4_;
  auVar232._4_4_ = fVar173 * auVar104._4_4_;
  fVar174 = auVar97._8_4_;
  auVar232._8_4_ = fVar174 * auVar104._8_4_;
  fVar175 = auVar97._12_4_;
  auVar232._12_4_ = fVar175 * auVar104._12_4_;
  auVar203._0_4_ = auVar27._0_4_ * fVar179;
  auVar203._4_4_ = auVar27._4_4_ * fVar173;
  auVar203._8_4_ = auVar27._8_4_ * fVar174;
  auVar203._12_4_ = auVar27._12_4_ * fVar175;
  auVar188._0_4_ = auVar30._0_4_ * fVar179;
  auVar188._4_4_ = auVar30._4_4_ * fVar173;
  auVar188._8_4_ = auVar30._8_4_ * fVar174;
  auVar188._12_4_ = auVar30._12_4_ * fVar175;
  auVar96 = vfmadd231ps_fma(auVar232,auVar103,auVar96);
  auVar104 = vfmadd231ps_fma(auVar203,auVar103,auVar26);
  auVar26 = vfmadd231ps_fma(auVar188,auVar103,auVar29);
  auVar27 = vfmadd231ps_fma(auVar96,auVar231,auVar98);
  auVar29 = vfmadd231ps_fma(auVar104,auVar231,auVar161);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar30 = vfmadd231ps_fma(auVar26,auVar231,auVar28);
  auVar98 = vandps_avx(auVar99,auVar219);
  auVar216._8_4_ = 0x219392ef;
  auVar216._0_8_ = 0x219392ef219392ef;
  auVar216._12_4_ = 0x219392ef;
  uVar92 = vcmpps_avx512vl(auVar98,auVar216,1);
  bVar12 = (bool)((byte)uVar92 & 1);
  auVar97._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar99._0_4_;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar99._4_4_;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar99._8_4_;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar99._12_4_;
  auVar98 = vandps_avx(auVar102,auVar219);
  uVar92 = vcmpps_avx512vl(auVar98,auVar216,1);
  bVar12 = (bool)((byte)uVar92 & 1);
  auVar99._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar102._0_4_;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar102._4_4_;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar102._8_4_;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar102._12_4_;
  auVar98 = vandps_avx(auVar159,auVar219);
  uVar92 = vcmpps_avx512vl(auVar98,auVar216,1);
  bVar12 = (bool)((byte)uVar92 & 1);
  auVar102._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar159._0_4_;
  bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar159._4_4_;
  bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar159._8_4_;
  bVar12 = (bool)((byte)(uVar92 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar159._12_4_;
  auVar96 = vrcp14ps_avx512vl(auVar97);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = 0x3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar98 = vfnmadd213ps_fma(auVar97,auVar96,auVar217);
  auVar161 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar99);
  auVar98 = vfnmadd213ps_fma(auVar99,auVar96,auVar217);
  auVar26 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar102);
  auVar98 = vfnmadd213ps_fma(auVar102,auVar96,auVar217);
  auVar28 = vfmadd132ps_fma(auVar98,auVar96,auVar96);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar88 * 7 + 6);
  auVar98 = vpmovsxwd_avx(auVar98);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar27);
  auVar210._0_4_ = auVar161._0_4_ * auVar98._0_4_;
  auVar210._4_4_ = auVar161._4_4_ * auVar98._4_4_;
  auVar210._8_4_ = auVar161._8_4_ * auVar98._8_4_;
  auVar210._12_4_ = auVar161._12_4_ * auVar98._12_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar88 * 9 + 6);
  auVar98 = vpmovsxwd_avx(auVar96);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar27);
  auVar97 = vpbroadcastd_avx512vl();
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar96 = vpmovsxwd_avx(auVar104);
  auVar180._0_4_ = auVar161._0_4_ * auVar98._0_4_;
  auVar180._4_4_ = auVar161._4_4_ * auVar98._4_4_;
  auVar180._8_4_ = auVar161._8_4_ * auVar98._8_4_;
  auVar180._12_4_ = auVar161._12_4_ * auVar98._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar88 * -2 + 6);
  auVar98 = vpmovsxwd_avx(auVar161);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar29);
  auVar218._0_4_ = auVar26._0_4_ * auVar98._0_4_;
  auVar218._4_4_ = auVar26._4_4_ * auVar98._4_4_;
  auVar218._8_4_ = auVar26._8_4_ * auVar98._8_4_;
  auVar218._12_4_ = auVar26._12_4_ * auVar98._12_4_;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,auVar29);
  auVar176._0_4_ = auVar26._0_4_ * auVar98._0_4_;
  auVar176._4_4_ = auVar26._4_4_ * auVar98._4_4_;
  auVar176._8_4_ = auVar26._8_4_ * auVar98._8_4_;
  auVar176._12_4_ = auVar26._12_4_ * auVar98._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar84 + uVar88 + 6);
  auVar98 = vpmovsxwd_avx(auVar26);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar30);
  auVar204._0_4_ = auVar28._0_4_ * auVar98._0_4_;
  auVar204._4_4_ = auVar28._4_4_ * auVar98._4_4_;
  auVar204._8_4_ = auVar28._8_4_ * auVar98._8_4_;
  auVar204._12_4_ = auVar28._12_4_ * auVar98._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar88 * 0x17 + 6);
  auVar98 = vpmovsxwd_avx(auVar27);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,auVar30);
  auVar100._0_4_ = auVar28._0_4_ * auVar98._0_4_;
  auVar100._4_4_ = auVar28._4_4_ * auVar98._4_4_;
  auVar100._8_4_ = auVar28._8_4_ * auVar98._8_4_;
  auVar100._12_4_ = auVar28._12_4_ * auVar98._12_4_;
  auVar98 = vpminsd_avx(auVar210,auVar180);
  auVar96 = vpminsd_avx(auVar218,auVar176);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx(auVar204,auVar100);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar28._4_4_ = uVar158;
  auVar28._0_4_ = uVar158;
  auVar28._8_4_ = uVar158;
  auVar28._12_4_ = uVar158;
  auVar96 = vmaxps_avx512vl(auVar96,auVar28);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar98,auVar29);
  auVar98 = vpmaxsd_avx(auVar210,auVar180);
  auVar96 = vpmaxsd_avx(auVar218,auVar176);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx(auVar204,auVar100);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar30._4_4_ = uVar158;
  auVar30._0_4_ = uVar158;
  auVar30._8_4_ = uVar158;
  auVar30._12_4_ = uVar158;
  auVar96 = vminps_avx512vl(auVar96,auVar30);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar103._8_4_ = 0x3f800003;
  auVar103._0_8_ = 0x3f8000033f800003;
  auVar103._12_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar103);
  uVar31 = vcmpps_avx512vl(local_4b0,auVar98,2);
  uVar92 = vpcmpgtd_avx512vl(auVar97,_DAT_01f7fcf0);
  uVar92 = ((byte)uVar31 & 0xf) & uVar92;
  if ((char)uVar92 != '\0') {
    local_850 = (undefined1 (*) [32])local_100;
    auVar172 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar172);
    do {
      auVar172 = local_440;
      lVar35 = 0;
      for (uVar84 = uVar92; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        lVar35 = lVar35 + 1;
      }
      uVar89 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar35 * 4 + 6);
      pGVar91 = (context->scene->geometries).items[uVar89].ptr;
      uVar84 = (ulong)*(uint *)(*(long *)&pGVar91->field_0x58 +
                               pGVar91[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var11 = pGVar91[1].intersectionFilterN;
      lVar35 = *(long *)&pGVar91[1].time_range.upper;
      auVar98 = *(undefined1 (*) [16])(lVar35 + (long)p_Var11 * uVar84);
      pauVar3 = (undefined1 (*) [16])(lVar35 + (uVar84 + 1) * (long)p_Var11);
      uVar31 = *(undefined8 *)*pauVar3;
      uVar76 = *(undefined8 *)(*pauVar3 + 8);
      auVar30 = *pauVar3;
      auVar28 = *pauVar3;
      auVar26 = *pauVar3;
      auVar96 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar35 + (uVar84 + 2) * (long)p_Var11);
      uVar77 = *(undefined8 *)*pauVar4;
      uVar78 = *(undefined8 *)(*pauVar4 + 8);
      auVar29 = *pauVar4;
      auVar27 = *pauVar4;
      auVar161 = *pauVar4;
      auVar104 = *pauVar4;
      uVar92 = uVar92 - 1 & uVar92;
      pauVar5 = (undefined1 (*) [12])(lVar35 + (uVar84 + 3) * (long)p_Var11);
      uVar79 = *(undefined8 *)*pauVar5;
      uVar80 = *(undefined8 *)(*pauVar5 + 8);
      local_8c0 = (float)uVar79;
      fStack_8bc = (float)((ulong)uVar79 >> 0x20);
      fStack_8b8 = (float)uVar80;
      fStack_8b4 = (float)((ulong)uVar80 >> 0x20);
      if (uVar92 != 0) {
        uVar88 = uVar92 - 1 & uVar92;
        for (uVar84 = uVar92; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        }
        if (uVar88 != 0) {
          for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar87 = (int)pGVar91[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar103 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar103 = vinsertps_avx(auVar103,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar102 = vsubps_avx(auVar98,auVar103);
      uVar158 = auVar102._0_4_;
      auVar181._4_4_ = uVar158;
      auVar181._0_4_ = uVar158;
      auVar181._8_4_ = uVar158;
      auVar181._12_4_ = uVar158;
      auVar97 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar179 = pre->ray_space[k].vz.field_0.m128[0];
      fVar173 = pre->ray_space[k].vz.field_0.m128[1];
      fVar174 = pre->ray_space[k].vz.field_0.m128[2];
      fVar175 = pre->ray_space[k].vz.field_0.m128[3];
      auVar222._0_4_ = fVar179 * auVar102._0_4_;
      auVar222._4_4_ = fVar173 * auVar102._4_4_;
      auVar222._8_4_ = fVar174 * auVar102._8_4_;
      auVar222._12_4_ = fVar175 * auVar102._12_4_;
      auVar97 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar7,auVar97);
      auVar159 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar6,auVar181);
      auVar97 = vshufps_avx(auVar98,auVar98,0xff);
      auVar99 = vsubps_avx512vl(auVar96,auVar103);
      uVar158 = auVar99._0_4_;
      auVar189._4_4_ = uVar158;
      auVar189._0_4_ = uVar158;
      auVar189._8_4_ = uVar158;
      auVar189._12_4_ = uVar158;
      auVar102 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar223._0_4_ = fVar179 * auVar99._0_4_;
      auVar223._4_4_ = fVar173 * auVar99._4_4_;
      auVar223._8_4_ = fVar174 * auVar99._8_4_;
      auVar223._12_4_ = fVar175 * auVar99._12_4_;
      auVar102 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar102);
      auVar160 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar6,auVar189);
      auVar100 = vshufps_avx512vl(auVar96,auVar96,0xff);
      auVar99 = vsubps_avx512vl(auVar104,auVar103);
      uVar158 = auVar99._0_4_;
      auVar220._4_4_ = uVar158;
      auVar220._0_4_ = uVar158;
      auVar220._8_4_ = uVar158;
      auVar220._12_4_ = uVar158;
      auVar102 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar226._0_4_ = fVar179 * auVar99._0_4_;
      auVar226._4_4_ = fVar173 * auVar99._4_4_;
      auVar226._8_4_ = fVar174 * auVar99._8_4_;
      auVar226._12_4_ = fVar175 * auVar99._12_4_;
      auVar102 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar7,auVar102);
      auVar99 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar6,auVar220);
      auVar101 = vshufps_avx512vl(auVar104,auVar104,0xff);
      auVar81._12_4_ = fStack_8b4;
      auVar81._0_12_ = *pauVar5;
      auVar102 = vsubps_avx512vl(auVar81,auVar103);
      uVar158 = auVar102._0_4_;
      auVar190._4_4_ = uVar158;
      auVar190._0_4_ = uVar158;
      auVar190._8_4_ = uVar158;
      auVar190._12_4_ = uVar158;
      auVar103 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      auVar228._0_4_ = fVar179 * auVar102._0_4_;
      auVar228._4_4_ = fVar173 * auVar102._4_4_;
      auVar228._8_4_ = fVar174 * auVar102._8_4_;
      auVar228._12_4_ = fVar175 * auVar102._12_4_;
      auVar103 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar7,auVar103);
      auVar102 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar6,auVar190);
      lVar35 = (long)iVar87 * 0x44;
      auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35);
      auVar103 = vshufps_avx512vl(auVar81,auVar81,0xff);
      uVar158 = auVar159._0_4_;
      local_600._4_4_ = uVar158;
      local_600._0_4_ = uVar158;
      local_600._8_4_ = uVar158;
      local_600._12_4_ = uVar158;
      local_600._16_4_ = uVar158;
      local_600._20_4_ = uVar158;
      local_600._24_4_ = uVar158;
      local_600._28_4_ = uVar158;
      auVar106._8_4_ = 1;
      auVar106._0_8_ = 0x100000001;
      auVar106._12_4_ = 1;
      auVar106._16_4_ = 1;
      auVar106._20_4_ = 1;
      auVar106._24_4_ = 1;
      auVar106._28_4_ = 1;
      local_620 = vpermps_avx2(auVar106,ZEXT1632(auVar159));
      local_320 = vbroadcastsd_avx512vl(auVar97);
      auVar123 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0x484);
      uVar158 = auVar160._0_4_;
      auVar177._4_4_ = uVar158;
      auVar177._0_4_ = uVar158;
      auVar177._8_4_ = uVar158;
      auVar177._12_4_ = uVar158;
      local_640._16_4_ = uVar158;
      local_640._0_16_ = auVar177;
      local_640._20_4_ = uVar158;
      local_640._24_4_ = uVar158;
      local_640._28_4_ = uVar158;
      local_660 = vpermps_avx512vl(auVar106,ZEXT1632(auVar160));
      local_340 = vbroadcastsd_avx512vl(auVar100);
      auVar120 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0x908);
      uVar158 = auVar99._0_4_;
      local_680._4_4_ = uVar158;
      local_680._0_4_ = uVar158;
      local_680._8_4_ = uVar158;
      local_680._12_4_ = uVar158;
      local_680._16_4_ = uVar158;
      local_680._20_4_ = uVar158;
      local_680._24_4_ = uVar158;
      local_680._28_4_ = uVar158;
      local_6a0 = vpermps_avx512vl(auVar106,ZEXT1632(auVar99));
      local_360 = vbroadcastsd_avx512vl(auVar101);
      auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0xd8c);
      fVar173 = auVar102._0_4_;
      local_6c0._4_4_ = fVar173;
      local_6c0._0_4_ = fVar173;
      fStack_6b8 = fVar173;
      fStack_6b4 = fVar173;
      fStack_6b0 = fVar173;
      fStack_6ac = fVar173;
      fStack_6a8 = fVar173;
      register0x0000139c = fVar173;
      _local_6e0 = vpermps_avx512vl(auVar106,ZEXT1632(auVar102));
      local_380 = vbroadcastsd_avx512vl(auVar103);
      auVar106 = vmulps_avx512vl(_local_6c0,auVar119);
      auVar107 = vmulps_avx512vl(_local_6e0,auVar119);
      auVar103 = vfmadd231ps_fma(auVar106,auVar120,local_680);
      auVar106 = vfmadd231ps_avx512vl(auVar107,auVar120,local_6a0);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar123,local_640);
      auVar108 = vfmadd231ps_avx512vl(auVar106,auVar123,local_660);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar122,local_600);
      auVar215 = ZEXT3264(auVar109);
      auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35);
      auVar107 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0x484);
      auVar110 = vfmadd231ps_avx512vl(auVar108,auVar122,local_620);
      auVar209 = ZEXT3264(auVar110);
      auVar108 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0x908);
      auVar118 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0xd8c);
      auVar111 = vmulps_avx512vl(_local_6c0,auVar118);
      auVar112 = vmulps_avx512vl(_local_6e0,auVar118);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_680);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_6a0);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,local_640);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_660);
      auVar97 = vfmadd231ps_fma(auVar111,auVar106,local_600);
      auVar221 = ZEXT1664(auVar97);
      auVar100 = vfmadd231ps_fma(auVar112,auVar106,local_620);
      auVar111 = vsubps_avx512vl(ZEXT1632(auVar97),auVar109);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar100),auVar110);
      auVar113 = vmulps_avx512vl(auVar110,auVar111);
      auVar114 = vmulps_avx512vl(auVar109,auVar112);
      auVar113 = vsubps_avx512vl(auVar113,auVar114);
      auVar114 = vmulps_avx512vl(local_380,auVar119);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar120,local_360);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_340);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_320);
      auVar115 = vmulps_avx512vl(local_380,auVar118);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar108,local_360);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar107,local_340);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,local_320);
      auVar116 = vmulps_avx512vl(auVar112,auVar112);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,auVar111);
      auVar117 = vmaxps_avx512vl(auVar114,auVar115);
      auVar117 = vmulps_avx512vl(auVar117,auVar117);
      auVar116 = vmulps_avx512vl(auVar117,auVar116);
      auVar113 = vmulps_avx512vl(auVar113,auVar113);
      uVar32 = vcmpps_avx512vl(auVar113,auVar116,2);
      auVar103 = vblendps_avx(auVar159,auVar98,8);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar103 = vandps_avx512vl(auVar103,auVar101);
      auVar96 = vblendps_avx(auVar160,auVar96,8);
      auVar96 = vandps_avx512vl(auVar96,auVar101);
      auVar103 = vmaxps_avx(auVar103,auVar96);
      auVar96 = vblendps_avx(auVar99,auVar104,8);
      auVar104 = vandps_avx512vl(auVar96,auVar101);
      auVar96 = vblendps_avx(auVar102,auVar81,8);
      auVar96 = vandps_avx512vl(auVar96,auVar101);
      auVar96 = vmaxps_avx(auVar104,auVar96);
      auVar96 = vmaxps_avx(auVar103,auVar96);
      auVar104 = vmovshdup_avx(auVar96);
      auVar104 = vmaxss_avx(auVar104,auVar96);
      auVar96 = vshufpd_avx(auVar96,auVar96,1);
      auVar96 = vmaxss_avx(auVar96,auVar104);
      auVar117._0_4_ = (float)iVar87;
      local_440._4_12_ = auVar159._4_12_;
      local_440._0_4_ = auVar117._0_4_;
      local_440._16_48_ = auVar172._16_48_;
      auVar117._4_4_ = auVar117._0_4_;
      auVar117._8_4_ = auVar117._0_4_;
      auVar117._12_4_ = auVar117._0_4_;
      auVar117._16_4_ = auVar117._0_4_;
      auVar117._20_4_ = auVar117._0_4_;
      auVar117._24_4_ = auVar117._0_4_;
      auVar117._28_4_ = auVar117._0_4_;
      uVar33 = vcmpps_avx512vl(auVar117,_DAT_01faff40,0xe);
      bVar93 = (byte)uVar32 & (byte)uVar33;
      fVar179 = auVar96._0_4_ * 4.7683716e-07;
      local_820._0_16_ = ZEXT416((uint)fVar179);
      auVar116._8_4_ = 2;
      auVar116._0_8_ = 0x200000002;
      auVar116._12_4_ = 2;
      auVar116._16_4_ = 2;
      auVar116._20_4_ = 2;
      auVar116._24_4_ = 2;
      auVar116._28_4_ = 2;
      local_7a0 = vpermps_avx512vl(auVar116,ZEXT1632(auVar159));
      auVar172 = ZEXT3264(local_7a0);
      local_7c0 = vpermps_avx512vl(auVar116,ZEXT1632(auVar160));
      auVar239 = ZEXT3264(local_7c0);
      auVar113 = vpermps_avx512vl(auVar116,ZEXT1632(auVar99));
      local_4a0 = vpermps_avx2(auVar116,ZEXT1632(auVar102));
      local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_75c = 0;
      uStack_758 = 0;
      uStack_754 = 0;
      if (bVar93 != 0) {
        auVar118 = vmulps_avx512vl(local_4a0,auVar118);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar113,auVar118);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_7c0,auVar108);
        auVar116 = vfmadd213ps_avx512vl(auVar106,local_7a0,auVar107);
        auVar119 = vmulps_avx512vl(local_4a0,auVar119);
        auVar120 = vfmadd213ps_avx512vl(auVar120,auVar113,auVar119);
        auVar107 = vfmadd213ps_avx512vl(auVar123,local_7c0,auVar120);
        auVar123 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0x1694);
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar35 + 0x1f9c);
        auVar121 = vfmadd213ps_avx512vl(auVar122,local_7a0,auVar107);
        auVar224._0_4_ = fVar173 * auVar106._0_4_;
        auVar224._4_4_ = fVar173 * auVar106._4_4_;
        auVar224._8_4_ = fVar173 * auVar106._8_4_;
        auVar224._12_4_ = fVar173 * auVar106._12_4_;
        auVar224._16_4_ = fVar173 * auVar106._16_4_;
        auVar224._20_4_ = fVar173 * auVar106._20_4_;
        auVar224._24_4_ = fVar173 * auVar106._24_4_;
        auVar224._28_4_ = 0;
        auVar122 = vmulps_avx512vl(_local_6e0,auVar106);
        auVar106 = vmulps_avx512vl(local_4a0,auVar106);
        auVar107 = vfmadd231ps_avx512vl(auVar224,auVar119,local_680);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar119,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar106,auVar113,auVar119);
        auVar106 = vfmadd231ps_avx512vl(auVar107,auVar120,local_640);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,local_660);
        auVar107 = vfmadd231ps_avx512vl(auVar119,local_7c0,auVar120);
        auVar96 = vfmadd231ps_fma(auVar106,auVar123,local_600);
        auVar106 = vfmadd231ps_avx512vl(auVar122,auVar123,local_620);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0x1b18);
        auVar119 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0x1f9c);
        auVar108 = vfmadd231ps_avx512vl(auVar107,local_7a0,auVar123);
        auVar107._4_4_ = fVar173 * auVar119._4_4_;
        auVar107._0_4_ = fVar173 * auVar119._0_4_;
        auVar107._8_4_ = fVar173 * auVar119._8_4_;
        auVar107._12_4_ = fVar173 * auVar119._12_4_;
        auVar107._16_4_ = fVar173 * auVar119._16_4_;
        auVar107._20_4_ = fVar173 * auVar119._20_4_;
        auVar107._24_4_ = fVar173 * auVar119._24_4_;
        auVar107._28_4_ = auVar123._28_4_;
        auVar123 = vmulps_avx512vl(_local_6e0,auVar119);
        auVar119 = vmulps_avx512vl(local_4a0,auVar119);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar120,local_680);
        auVar118 = vfmadd231ps_avx512vl(auVar123,auVar120,local_6a0);
        auVar172 = ZEXT3264(local_7a0);
        auVar239 = ZEXT3264(local_7c0);
        auVar238 = ZEXT3264(auVar113);
        auVar120 = vfmadd231ps_avx512vl(auVar119,auVar113,auVar120);
        auVar123 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar35 + 0x1694);
        auVar119 = vfmadd231ps_avx512vl(auVar107,auVar123,local_640);
        auVar107 = vfmadd231ps_avx512vl(auVar118,auVar123,local_660);
        auVar123 = vfmadd231ps_avx512vl(auVar120,local_7c0,auVar123);
        auVar104 = vfmadd231ps_fma(auVar119,auVar122,local_600);
        auVar120 = vfmadd231ps_avx512vl(auVar107,auVar122,local_620);
        auVar119 = vfmadd231ps_avx512vl(auVar123,local_7a0,auVar122);
        auVar233._8_4_ = 0x7fffffff;
        auVar233._0_8_ = 0x7fffffff7fffffff;
        auVar233._12_4_ = 0x7fffffff;
        auVar233._16_4_ = 0x7fffffff;
        auVar233._20_4_ = 0x7fffffff;
        auVar233._24_4_ = 0x7fffffff;
        auVar233._28_4_ = 0x7fffffff;
        auVar122 = vandps_avx(ZEXT1632(auVar96),auVar233);
        auVar123 = vandps_avx(auVar106,auVar233);
        auVar123 = vmaxps_avx(auVar122,auVar123);
        auVar122 = vandps_avx(auVar108,auVar233);
        auVar122 = vmaxps_avx(auVar123,auVar122);
        auVar229._4_4_ = fVar179;
        auVar229._0_4_ = fVar179;
        auVar229._8_4_ = fVar179;
        auVar229._12_4_ = fVar179;
        auVar229._16_4_ = fVar179;
        auVar229._20_4_ = fVar179;
        auVar229._24_4_ = fVar179;
        auVar229._28_4_ = fVar179;
        uVar84 = vcmpps_avx512vl(auVar122,auVar229,1);
        bVar12 = (bool)((byte)uVar84 & 1);
        auVar124._0_4_ = (float)((uint)bVar12 * auVar111._0_4_ | (uint)!bVar12 * auVar96._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar96._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar96._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar96._12_4_);
        fVar174 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar111._16_4_);
        auVar124._16_4_ = fVar174;
        fVar179 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar111._20_4_);
        auVar124._20_4_ = fVar179;
        fVar173 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar111._24_4_);
        auVar124._24_4_ = fVar173;
        uVar85 = (uint)(byte)(uVar84 >> 7) * auVar111._28_4_;
        auVar124._28_4_ = uVar85;
        bVar12 = (bool)((byte)uVar84 & 1);
        auVar125._0_4_ = (float)((uint)bVar12 * auVar112._0_4_ | (uint)!bVar12 * auVar106._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar106._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar106._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar106._12_4_);
        bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar12 * auVar112._16_4_ | (uint)!bVar12 * auVar106._16_4_);
        bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar12 * auVar112._20_4_ | (uint)!bVar12 * auVar106._20_4_);
        bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar12 * auVar112._24_4_ | (uint)!bVar12 * auVar106._24_4_);
        bVar12 = SUB81(uVar84 >> 7,0);
        auVar125._28_4_ = (uint)bVar12 * auVar112._28_4_ | (uint)!bVar12 * auVar106._28_4_;
        auVar122 = vandps_avx(auVar233,ZEXT1632(auVar104));
        auVar123 = vandps_avx(auVar120,auVar233);
        auVar123 = vmaxps_avx(auVar122,auVar123);
        auVar122 = vandps_avx(auVar119,auVar233);
        auVar122 = vmaxps_avx(auVar123,auVar122);
        uVar84 = vcmpps_avx512vl(auVar122,auVar229,1);
        bVar12 = (bool)((byte)uVar84 & 1);
        auVar126._0_4_ = (float)((uint)bVar12 * auVar111._0_4_ | (uint)!bVar12 * auVar104._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar104._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar104._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar104._12_4_);
        fVar202 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar111._16_4_);
        auVar126._16_4_ = fVar202;
        fVar186 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar111._20_4_);
        auVar126._20_4_ = fVar186;
        fVar175 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar111._24_4_);
        auVar126._24_4_ = fVar175;
        auVar126._28_4_ = (uint)(byte)(uVar84 >> 7) * auVar111._28_4_;
        bVar12 = (bool)((byte)uVar84 & 1);
        auVar127._0_4_ = (float)((uint)bVar12 * auVar112._0_4_ | (uint)!bVar12 * auVar120._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar120._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar120._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar120._12_4_);
        bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar12 * auVar112._16_4_ | (uint)!bVar12 * auVar120._16_4_);
        bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar12 * auVar112._20_4_ | (uint)!bVar12 * auVar120._20_4_);
        bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar12 * auVar112._24_4_ | (uint)!bVar12 * auVar120._24_4_);
        bVar12 = SUB81(uVar84 >> 7,0);
        auVar127._28_4_ = (uint)bVar12 * auVar112._28_4_ | (uint)!bVar12 * auVar120._28_4_;
        auVar105 = vxorps_avx512vl(auVar177,auVar177);
        auVar122 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar105));
        auVar96 = vfmadd231ps_fma(auVar122,auVar125,auVar125);
        auVar120 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar94 = auVar120._0_4_;
        fVar95 = auVar120._4_4_;
        fVar149 = auVar120._8_4_;
        fVar150 = auVar120._12_4_;
        fVar151 = auVar120._16_4_;
        fVar152 = auVar120._20_4_;
        fVar154 = auVar120._24_4_;
        auVar122._4_4_ = fVar95 * fVar95 * fVar95 * auVar96._4_4_ * -0.5;
        auVar122._0_4_ = fVar94 * fVar94 * fVar94 * auVar96._0_4_ * -0.5;
        auVar122._8_4_ = fVar149 * fVar149 * fVar149 * auVar96._8_4_ * -0.5;
        auVar122._12_4_ = fVar150 * fVar150 * fVar150 * auVar96._12_4_ * -0.5;
        auVar122._16_4_ = fVar151 * fVar151 * fVar151 * -0.0;
        auVar122._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
        auVar122._24_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar122._28_4_ = 0;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar106,auVar120);
        auVar123._4_4_ = auVar125._4_4_ * auVar122._4_4_;
        auVar123._0_4_ = auVar125._0_4_ * auVar122._0_4_;
        auVar123._8_4_ = auVar125._8_4_ * auVar122._8_4_;
        auVar123._12_4_ = auVar125._12_4_ * auVar122._12_4_;
        auVar123._16_4_ = auVar125._16_4_ * auVar122._16_4_;
        auVar123._20_4_ = auVar125._20_4_ * auVar122._20_4_;
        auVar123._24_4_ = auVar125._24_4_ * auVar122._24_4_;
        auVar123._28_4_ = auVar120._28_4_;
        auVar120._4_4_ = auVar122._4_4_ * -auVar124._4_4_;
        auVar120._0_4_ = auVar122._0_4_ * -auVar124._0_4_;
        auVar120._8_4_ = auVar122._8_4_ * -auVar124._8_4_;
        auVar120._12_4_ = auVar122._12_4_ * -auVar124._12_4_;
        auVar120._16_4_ = auVar122._16_4_ * -fVar174;
        auVar120._20_4_ = auVar122._20_4_ * -fVar179;
        auVar120._24_4_ = auVar122._24_4_ * -fVar173;
        auVar120._28_4_ = uVar85 ^ 0x80000000;
        auVar107 = vmulps_avx512vl(auVar122,ZEXT1632(auVar105));
        auVar111 = ZEXT1632(auVar105);
        auVar119 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar111);
        auVar96 = vfmadd231ps_fma(auVar119,auVar127,auVar127);
        auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar179 = auVar118._0_4_;
        fVar173 = auVar118._4_4_;
        fVar174 = auVar118._8_4_;
        fVar94 = auVar118._12_4_;
        fVar95 = auVar118._16_4_;
        fVar149 = auVar118._20_4_;
        fVar150 = auVar118._24_4_;
        auVar119._4_4_ = fVar173 * fVar173 * fVar173 * auVar96._4_4_ * -0.5;
        auVar119._0_4_ = fVar179 * fVar179 * fVar179 * auVar96._0_4_ * -0.5;
        auVar119._8_4_ = fVar174 * fVar174 * fVar174 * auVar96._8_4_ * -0.5;
        auVar119._12_4_ = fVar94 * fVar94 * fVar94 * auVar96._12_4_ * -0.5;
        auVar119._16_4_ = fVar95 * fVar95 * fVar95 * -0.0;
        auVar119._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
        auVar119._24_4_ = fVar150 * fVar150 * fVar150 * -0.0;
        auVar119._28_4_ = 0;
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar106,auVar118);
        auVar108._4_4_ = auVar127._4_4_ * auVar119._4_4_;
        auVar108._0_4_ = auVar127._0_4_ * auVar119._0_4_;
        auVar108._8_4_ = auVar127._8_4_ * auVar119._8_4_;
        auVar108._12_4_ = auVar127._12_4_ * auVar119._12_4_;
        auVar108._16_4_ = auVar127._16_4_ * auVar119._16_4_;
        auVar108._20_4_ = auVar127._20_4_ * auVar119._20_4_;
        auVar108._24_4_ = auVar127._24_4_ * auVar119._24_4_;
        auVar108._28_4_ = auVar118._28_4_;
        auVar118._4_4_ = -auVar126._4_4_ * auVar119._4_4_;
        auVar118._0_4_ = -auVar126._0_4_ * auVar119._0_4_;
        auVar118._8_4_ = -auVar126._8_4_ * auVar119._8_4_;
        auVar118._12_4_ = -auVar126._12_4_ * auVar119._12_4_;
        auVar118._16_4_ = -fVar202 * auVar119._16_4_;
        auVar118._20_4_ = -fVar186 * auVar119._20_4_;
        auVar118._24_4_ = -fVar175 * auVar119._24_4_;
        auVar118._28_4_ = auVar122._28_4_;
        auVar122 = vmulps_avx512vl(auVar119,auVar111);
        auVar96 = vfmadd213ps_fma(auVar123,auVar114,auVar109);
        auVar104 = vfmadd213ps_fma(auVar120,auVar114,auVar110);
        auVar119 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar121);
        auVar106 = vfmadd213ps_avx512vl(auVar108,auVar115,ZEXT1632(auVar97));
        auVar159 = vfnmadd213ps_fma(auVar123,auVar114,auVar109);
        auVar103 = vfmadd213ps_fma(auVar118,auVar115,ZEXT1632(auVar100));
        auVar160 = vfnmadd213ps_fma(auVar120,auVar114,auVar110);
        auVar102 = vfmadd213ps_fma(auVar122,auVar115,auVar116);
        auVar123 = vfnmadd231ps_avx512vl(auVar121,auVar114,auVar107);
        auVar101 = vfnmadd213ps_fma(auVar108,auVar115,ZEXT1632(auVar97));
        auVar100 = vfnmadd213ps_fma(auVar118,auVar115,ZEXT1632(auVar100));
        auVar176 = vfnmadd231ps_fma(auVar116,auVar115,auVar122);
        auVar120 = vsubps_avx512vl(auVar106,ZEXT1632(auVar159));
        auVar122 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar160));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar102),auVar123);
        auVar108 = vmulps_avx512vl(auVar122,auVar123);
        auVar97 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar160),auVar107);
        auVar109._4_4_ = auVar159._4_4_ * auVar107._4_4_;
        auVar109._0_4_ = auVar159._0_4_ * auVar107._0_4_;
        auVar109._8_4_ = auVar159._8_4_ * auVar107._8_4_;
        auVar109._12_4_ = auVar159._12_4_ * auVar107._12_4_;
        auVar109._16_4_ = auVar107._16_4_ * 0.0;
        auVar109._20_4_ = auVar107._20_4_ * 0.0;
        auVar109._24_4_ = auVar107._24_4_ * 0.0;
        auVar109._28_4_ = auVar107._28_4_;
        auVar107 = vfmsub231ps_avx512vl(auVar109,auVar123,auVar120);
        auVar110._4_4_ = auVar160._4_4_ * auVar120._4_4_;
        auVar110._0_4_ = auVar160._0_4_ * auVar120._0_4_;
        auVar110._8_4_ = auVar160._8_4_ * auVar120._8_4_;
        auVar110._12_4_ = auVar160._12_4_ * auVar120._12_4_;
        auVar110._16_4_ = auVar120._16_4_ * 0.0;
        auVar110._20_4_ = auVar120._20_4_ * 0.0;
        auVar110._24_4_ = auVar120._24_4_ * 0.0;
        auVar110._28_4_ = auVar120._28_4_;
        auVar99 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar159),auVar122);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar111,auVar107);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar111,ZEXT1632(auVar97));
        auVar116 = ZEXT1632(auVar105);
        uVar84 = vcmpps_avx512vl(auVar122,auVar116,2);
        bVar83 = (byte)uVar84;
        fVar94 = (float)((uint)(bVar83 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar101._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        fVar149 = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar101._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        fVar151 = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar101._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        fVar154 = (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar101._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar151,CONCAT44(fVar149,fVar94))));
        fVar95 = (float)((uint)(bVar83 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar100._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        fVar150 = (float)((uint)bVar12 * auVar104._4_4_ | (uint)!bVar12 * auVar100._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        fVar152 = (float)((uint)bVar12 * auVar104._8_4_ | (uint)!bVar12 * auVar100._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        fVar155 = (float)((uint)bVar12 * auVar104._12_4_ | (uint)!bVar12 * auVar100._12_4_);
        auVar118 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar150,fVar95))));
        auVar128._0_4_ =
             (float)((uint)(bVar83 & 1) * auVar119._0_4_ |
                    (uint)!(bool)(bVar83 & 1) * auVar176._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar12 * auVar119._4_4_ | (uint)!bVar12 * auVar176._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar12 * auVar119._8_4_ | (uint)!bVar12 * auVar176._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar12 * auVar119._12_4_ | (uint)!bVar12 * auVar176._12_4_);
        fVar174 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar119._16_4_);
        auVar128._16_4_ = fVar174;
        fVar173 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar119._20_4_);
        auVar128._20_4_ = fVar173;
        fVar179 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar119._24_4_);
        auVar128._24_4_ = fVar179;
        iVar1 = (uint)(byte)(uVar84 >> 7) * auVar119._28_4_;
        auVar128._28_4_ = iVar1;
        auVar120 = vblendmps_avx512vl(ZEXT1632(auVar159),auVar106);
        auVar129._0_4_ =
             (uint)(bVar83 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar97._0_4_;
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * auVar97._4_4_;
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * auVar97._8_4_;
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * auVar97._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * auVar120._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * auVar120._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * auVar120._24_4_;
        auVar129._28_4_ = (uint)(byte)(uVar84 >> 7) * auVar120._28_4_;
        auVar120 = vblendmps_avx512vl(ZEXT1632(auVar160),ZEXT1632(auVar103));
        auVar130._0_4_ =
             (float)((uint)(bVar83 & 1) * auVar120._0_4_ |
                    (uint)!(bool)(bVar83 & 1) * auVar104._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * auVar104._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * auVar104._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * auVar104._12_4_);
        fVar175 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar120._16_4_);
        auVar130._16_4_ = fVar175;
        fVar186 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar120._20_4_);
        auVar130._20_4_ = fVar186;
        fVar202 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar120._24_4_);
        auVar130._24_4_ = fVar202;
        auVar130._28_4_ = (uint)(byte)(uVar84 >> 7) * auVar120._28_4_;
        auVar120 = vblendmps_avx512vl(auVar123,ZEXT1632(auVar102));
        auVar131._0_4_ =
             (float)((uint)(bVar83 & 1) * auVar120._0_4_ |
                    (uint)!(bool)(bVar83 & 1) * auVar119._0_4_);
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * auVar119._4_4_);
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * auVar119._8_4_);
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * auVar119._12_4_);
        bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar131._16_4_ = (float)((uint)bVar12 * auVar120._16_4_ | (uint)!bVar12 * auVar119._16_4_);
        bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar131._20_4_ = (float)((uint)bVar12 * auVar120._20_4_ | (uint)!bVar12 * auVar119._20_4_);
        bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar131._24_4_ = (float)((uint)bVar12 * auVar120._24_4_ | (uint)!bVar12 * auVar119._24_4_);
        bVar12 = SUB81(uVar84 >> 7,0);
        auVar131._28_4_ = (uint)bVar12 * auVar120._28_4_ | (uint)!bVar12 * auVar119._28_4_;
        auVar132._0_4_ =
             (uint)(bVar83 & 1) * (int)auVar159._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar106._0_4_;
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar12 * (int)auVar159._4_4_ | (uint)!bVar12 * auVar106._4_4_;
        bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar12 * (int)auVar159._8_4_ | (uint)!bVar12 * auVar106._8_4_;
        bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar12 * (int)auVar159._12_4_ | (uint)!bVar12 * auVar106._12_4_;
        auVar132._16_4_ = (uint)!(bool)((byte)(uVar84 >> 4) & 1) * auVar106._16_4_;
        auVar132._20_4_ = (uint)!(bool)((byte)(uVar84 >> 5) & 1) * auVar106._20_4_;
        auVar132._24_4_ = (uint)!(bool)((byte)(uVar84 >> 6) & 1) * auVar106._24_4_;
        auVar132._28_4_ = (uint)!SUB81(uVar84 >> 7,0) * auVar106._28_4_;
        bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar133._0_4_ =
             (uint)(bVar83 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar102._0_4_;
        bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar102._4_4_;
        bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar102._8_4_;
        bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar102._12_4_;
        auVar133._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * auVar123._16_4_;
        auVar133._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * auVar123._20_4_;
        auVar133._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * auVar123._24_4_;
        iVar2 = (uint)(byte)(uVar84 >> 7) * auVar123._28_4_;
        auVar133._28_4_ = iVar2;
        auVar109 = vsubps_avx512vl(auVar132,auVar108);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar160._12_4_ |
                                                 (uint)!bVar15 * auVar103._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar160._8_4_ |
                                                          (uint)!bVar14 * auVar103._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar160._4_4_ |
                                                                   (uint)!bVar12 * auVar103._4_4_,
                                                                   (uint)(bVar83 & 1) *
                                                                   (int)auVar160._0_4_ |
                                                                   (uint)!(bool)(bVar83 & 1) *
                                                                   auVar103._0_4_)))),auVar118);
        auVar215 = ZEXT3264(auVar123);
        auVar120 = vsubps_avx(auVar133,auVar128);
        auVar119 = vsubps_avx(auVar108,auVar129);
        auVar221 = ZEXT3264(auVar119);
        auVar106 = vsubps_avx(auVar118,auVar130);
        auVar107 = vsubps_avx(auVar128,auVar131);
        auVar111._4_4_ = auVar120._4_4_ * fVar149;
        auVar111._0_4_ = auVar120._0_4_ * fVar94;
        auVar111._8_4_ = auVar120._8_4_ * fVar151;
        auVar111._12_4_ = auVar120._12_4_ * fVar154;
        auVar111._16_4_ = auVar120._16_4_ * 0.0;
        auVar111._20_4_ = auVar120._20_4_ * 0.0;
        auVar111._24_4_ = auVar120._24_4_ * 0.0;
        auVar111._28_4_ = iVar2;
        auVar96 = vfmsub231ps_fma(auVar111,auVar128,auVar109);
        auVar112._4_4_ = fVar150 * auVar109._4_4_;
        auVar112._0_4_ = fVar95 * auVar109._0_4_;
        auVar112._8_4_ = fVar152 * auVar109._8_4_;
        auVar112._12_4_ = fVar155 * auVar109._12_4_;
        auVar112._16_4_ = auVar109._16_4_ * 0.0;
        auVar112._20_4_ = auVar109._20_4_ * 0.0;
        auVar112._24_4_ = auVar109._24_4_ * 0.0;
        auVar112._28_4_ = auVar122._28_4_;
        auVar104 = vfmsub231ps_fma(auVar112,auVar108,auVar123);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar116,ZEXT1632(auVar96));
        auVar205._0_4_ = auVar123._0_4_ * auVar128._0_4_;
        auVar205._4_4_ = auVar123._4_4_ * auVar128._4_4_;
        auVar205._8_4_ = auVar123._8_4_ * auVar128._8_4_;
        auVar205._12_4_ = auVar123._12_4_ * auVar128._12_4_;
        auVar205._16_4_ = auVar123._16_4_ * fVar174;
        auVar205._20_4_ = auVar123._20_4_ * fVar173;
        auVar205._24_4_ = auVar123._24_4_ * fVar179;
        auVar205._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar205,auVar118,auVar120);
        auVar110 = vfmadd231ps_avx512vl(auVar122,auVar116,ZEXT1632(auVar96));
        auVar122 = vmulps_avx512vl(auVar107,auVar129);
        auVar122 = vfmsub231ps_avx512vl(auVar122,auVar119,auVar131);
        auVar121._4_4_ = auVar106._4_4_ * auVar131._4_4_;
        auVar121._0_4_ = auVar106._0_4_ * auVar131._0_4_;
        auVar121._8_4_ = auVar106._8_4_ * auVar131._8_4_;
        auVar121._12_4_ = auVar106._12_4_ * auVar131._12_4_;
        auVar121._16_4_ = auVar106._16_4_ * auVar131._16_4_;
        auVar121._20_4_ = auVar106._20_4_ * auVar131._20_4_;
        auVar121._24_4_ = auVar106._24_4_ * auVar131._24_4_;
        auVar121._28_4_ = auVar131._28_4_;
        auVar96 = vfmsub231ps_fma(auVar121,auVar130,auVar107);
        auVar206._0_4_ = auVar130._0_4_ * auVar119._0_4_;
        auVar206._4_4_ = auVar130._4_4_ * auVar119._4_4_;
        auVar206._8_4_ = auVar130._8_4_ * auVar119._8_4_;
        auVar206._12_4_ = auVar130._12_4_ * auVar119._12_4_;
        auVar206._16_4_ = fVar175 * auVar119._16_4_;
        auVar206._20_4_ = fVar186 * auVar119._20_4_;
        auVar206._24_4_ = fVar202 * auVar119._24_4_;
        auVar206._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar206,auVar106,auVar129);
        auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar116,auVar122);
        auVar111 = vfmadd231ps_avx512vl(auVar122,auVar116,ZEXT1632(auVar96));
        auVar209 = ZEXT3264(auVar111);
        auVar122 = vmaxps_avx(auVar110,auVar111);
        uVar32 = vcmpps_avx512vl(auVar122,auVar116,2);
        bVar93 = bVar93 & (byte)uVar32;
        if (bVar93 != 0) {
          uVar158 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar234._4_4_ = uVar158;
          auVar234._0_4_ = uVar158;
          auVar234._8_4_ = uVar158;
          auVar234._12_4_ = uVar158;
          auVar234._16_4_ = uVar158;
          auVar234._20_4_ = uVar158;
          auVar234._24_4_ = uVar158;
          auVar234._28_4_ = uVar158;
          auVar237 = ZEXT3264(auVar234);
          auVar41._4_4_ = auVar107._4_4_ * auVar123._4_4_;
          auVar41._0_4_ = auVar107._0_4_ * auVar123._0_4_;
          auVar41._8_4_ = auVar107._8_4_ * auVar123._8_4_;
          auVar41._12_4_ = auVar107._12_4_ * auVar123._12_4_;
          auVar41._16_4_ = auVar107._16_4_ * auVar123._16_4_;
          auVar41._20_4_ = auVar107._20_4_ * auVar123._20_4_;
          auVar41._24_4_ = auVar107._24_4_ * auVar123._24_4_;
          auVar41._28_4_ = auVar122._28_4_;
          auVar97 = vfmsub231ps_fma(auVar41,auVar106,auVar120);
          auVar42._4_4_ = auVar120._4_4_ * auVar119._4_4_;
          auVar42._0_4_ = auVar120._0_4_ * auVar119._0_4_;
          auVar42._8_4_ = auVar120._8_4_ * auVar119._8_4_;
          auVar42._12_4_ = auVar120._12_4_ * auVar119._12_4_;
          auVar42._16_4_ = auVar120._16_4_ * auVar119._16_4_;
          auVar42._20_4_ = auVar120._20_4_ * auVar119._20_4_;
          auVar42._24_4_ = auVar120._24_4_ * auVar119._24_4_;
          auVar42._28_4_ = auVar120._28_4_;
          auVar103 = vfmsub231ps_fma(auVar42,auVar109,auVar107);
          auVar43._4_4_ = auVar106._4_4_ * auVar109._4_4_;
          auVar43._0_4_ = auVar106._0_4_ * auVar109._0_4_;
          auVar43._8_4_ = auVar106._8_4_ * auVar109._8_4_;
          auVar43._12_4_ = auVar106._12_4_ * auVar109._12_4_;
          auVar43._16_4_ = auVar106._16_4_ * auVar109._16_4_;
          auVar43._20_4_ = auVar106._20_4_ * auVar109._20_4_;
          auVar43._24_4_ = auVar106._24_4_ * auVar109._24_4_;
          auVar43._28_4_ = auVar106._28_4_;
          auVar102 = vfmsub231ps_fma(auVar43,auVar119,auVar123);
          auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar103),ZEXT1632(auVar102));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar97),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar122 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
          auVar221 = ZEXT3264(auVar122);
          auVar37._8_4_ = 0x3f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._12_4_ = 0x3f800000;
          auVar37._16_4_ = 0x3f800000;
          auVar37._20_4_ = 0x3f800000;
          auVar37._24_4_ = 0x3f800000;
          auVar37._28_4_ = 0x3f800000;
          auVar123 = vfnmadd213ps_avx512vl(auVar122,ZEXT1632(auVar104),auVar37);
          auVar96 = vfmadd132ps_fma(auVar123,auVar122,auVar122);
          auVar215 = ZEXT1664(auVar96);
          auVar44._4_4_ = auVar102._4_4_ * auVar128._4_4_;
          auVar44._0_4_ = auVar102._0_4_ * auVar128._0_4_;
          auVar44._8_4_ = auVar102._8_4_ * auVar128._8_4_;
          auVar44._12_4_ = auVar102._12_4_ * auVar128._12_4_;
          auVar44._16_4_ = fVar174 * 0.0;
          auVar44._20_4_ = fVar173 * 0.0;
          auVar44._24_4_ = fVar179 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar103 = vfmadd231ps_fma(auVar44,auVar118,ZEXT1632(auVar103));
          auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar108,ZEXT1632(auVar97));
          fVar179 = auVar96._0_4_;
          fVar173 = auVar96._4_4_;
          fVar174 = auVar96._8_4_;
          fVar175 = auVar96._12_4_;
          local_5a0 = ZEXT1632(CONCAT412(auVar103._12_4_ * fVar175,
                                         CONCAT48(auVar103._8_4_ * fVar174,
                                                  CONCAT44(auVar103._4_4_ * fVar173,
                                                           auVar103._0_4_ * fVar179))));
          auVar227 = ZEXT3264(local_5a0);
          auVar164._4_4_ = local_760;
          auVar164._0_4_ = local_760;
          auVar164._8_4_ = local_760;
          auVar164._12_4_ = local_760;
          auVar164._16_4_ = local_760;
          auVar164._20_4_ = local_760;
          auVar164._24_4_ = local_760;
          auVar164._28_4_ = local_760;
          uVar32 = vcmpps_avx512vl(local_5a0,auVar234,2);
          uVar33 = vcmpps_avx512vl(auVar164,local_5a0,2);
          bVar93 = (byte)uVar32 & (byte)uVar33 & bVar93;
          if (bVar93 != 0) {
            uVar88 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar88 = bVar93 & uVar88;
            if ((char)uVar88 != '\0') {
              fVar186 = auVar110._0_4_ * fVar179;
              fVar202 = auVar110._4_4_ * fVar173;
              auVar45._4_4_ = fVar202;
              auVar45._0_4_ = fVar186;
              fVar94 = auVar110._8_4_ * fVar174;
              auVar45._8_4_ = fVar94;
              fVar95 = auVar110._12_4_ * fVar175;
              auVar45._12_4_ = fVar95;
              fVar149 = auVar110._16_4_ * 0.0;
              auVar45._16_4_ = fVar149;
              fVar150 = auVar110._20_4_ * 0.0;
              auVar45._20_4_ = fVar150;
              fVar151 = auVar110._24_4_ * 0.0;
              auVar45._24_4_ = fVar151;
              auVar45._28_4_ = auVar110._28_4_;
              auVar165._8_4_ = 0x3f800000;
              auVar165._0_8_ = 0x3f8000003f800000;
              auVar165._12_4_ = 0x3f800000;
              auVar165._16_4_ = 0x3f800000;
              auVar165._20_4_ = 0x3f800000;
              auVar165._24_4_ = 0x3f800000;
              auVar165._28_4_ = 0x3f800000;
              auVar122 = vsubps_avx(auVar165,auVar45);
              local_5e0._0_4_ =
                   (float)((uint)(bVar83 & 1) * (int)fVar186 |
                          (uint)!(bool)(bVar83 & 1) * auVar122._0_4_);
              bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
              local_5e0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar202 | (uint)!bVar12 * auVar122._4_4_);
              bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
              local_5e0._8_4_ = (float)((uint)bVar12 * (int)fVar94 | (uint)!bVar12 * auVar122._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
              local_5e0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar95 | (uint)!bVar12 * auVar122._12_4_);
              bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
              local_5e0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar149 | (uint)!bVar12 * auVar122._16_4_);
              bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
              local_5e0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar150 | (uint)!bVar12 * auVar122._20_4_);
              bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
              local_5e0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar151 | (uint)!bVar12 * auVar122._24_4_);
              bVar12 = SUB81(uVar84 >> 7,0);
              local_5e0._28_4_ =
                   (float)((uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar122._28_4_);
              auVar122 = vsubps_avx(auVar115,auVar114);
              auVar96 = vfmadd213ps_fma(auVar122,local_5e0,auVar114);
              uVar158 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar114._4_4_ = uVar158;
              auVar114._0_4_ = uVar158;
              auVar114._8_4_ = uVar158;
              auVar114._12_4_ = uVar158;
              auVar114._16_4_ = uVar158;
              auVar114._20_4_ = uVar158;
              auVar114._24_4_ = uVar158;
              auVar114._28_4_ = uVar158;
              auVar122 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                            CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                     CONCAT44(auVar96._4_4_ +
                                                                              auVar96._4_4_,
                                                                              auVar96._0_4_ +
                                                                              auVar96._0_4_)))),
                                         auVar114);
              uVar34 = vcmpps_avx512vl(local_5a0,auVar122,6);
              uVar88 = uVar88 & uVar34;
              bVar93 = (byte)uVar88;
              if (bVar93 != 0) {
                auVar184._0_4_ = auVar111._0_4_ * fVar179;
                auVar184._4_4_ = auVar111._4_4_ * fVar173;
                auVar184._8_4_ = auVar111._8_4_ * fVar174;
                auVar184._12_4_ = auVar111._12_4_ * fVar175;
                auVar184._16_4_ = auVar111._16_4_ * 0.0;
                auVar184._20_4_ = auVar111._20_4_ * 0.0;
                auVar184._24_4_ = auVar111._24_4_ * 0.0;
                auVar184._28_4_ = 0;
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar199._16_4_ = 0x3f800000;
                auVar199._20_4_ = 0x3f800000;
                auVar199._24_4_ = 0x3f800000;
                auVar199._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar199,auVar184);
                auVar134._0_4_ =
                     (uint)(bVar83 & 1) * (int)auVar184._0_4_ |
                     (uint)!(bool)(bVar83 & 1) * auVar122._0_4_;
                bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
                auVar134._4_4_ = (uint)bVar12 * (int)auVar184._4_4_ | (uint)!bVar12 * auVar122._4_4_
                ;
                bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                auVar134._8_4_ = (uint)bVar12 * (int)auVar184._8_4_ | (uint)!bVar12 * auVar122._8_4_
                ;
                bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
                auVar134._12_4_ =
                     (uint)bVar12 * (int)auVar184._12_4_ | (uint)!bVar12 * auVar122._12_4_;
                bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
                auVar134._16_4_ =
                     (uint)bVar12 * (int)auVar184._16_4_ | (uint)!bVar12 * auVar122._16_4_;
                bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
                auVar134._20_4_ =
                     (uint)bVar12 * (int)auVar184._20_4_ | (uint)!bVar12 * auVar122._20_4_;
                bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
                auVar134._24_4_ =
                     (uint)bVar12 * (int)auVar184._24_4_ | (uint)!bVar12 * auVar122._24_4_;
                auVar134._28_4_ = (uint)!SUB81(uVar84 >> 7,0) * auVar122._28_4_;
                auVar115._8_4_ = 0x40000000;
                auVar115._0_8_ = 0x4000000040000000;
                auVar115._12_4_ = 0x40000000;
                auVar115._16_4_ = 0x40000000;
                auVar115._20_4_ = 0x40000000;
                auVar115._24_4_ = 0x40000000;
                auVar115._28_4_ = 0x40000000;
                local_5c0 = vfmsub132ps_avx512vl(auVar134,auVar199,auVar115);
                local_580 = 0;
                if ((pGVar91->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar179 = 1.0 / auVar117._0_4_;
                  local_520[0] = fVar179 * (local_5e0._0_4_ + 0.0);
                  local_520[1] = fVar179 * (local_5e0._4_4_ + 1.0);
                  local_520[2] = fVar179 * (local_5e0._8_4_ + 2.0);
                  local_520[3] = fVar179 * (local_5e0._12_4_ + 3.0);
                  fStack_510 = fVar179 * (local_5e0._16_4_ + 4.0);
                  fStack_50c = fVar179 * (local_5e0._20_4_ + 5.0);
                  fStack_508 = fVar179 * (local_5e0._24_4_ + 6.0);
                  fStack_504 = local_5e0._28_4_ + 7.0;
                  local_500 = local_5c0;
                  local_4e0 = local_5a0;
                  auVar166._8_4_ = 0x7f800000;
                  auVar166._0_8_ = 0x7f8000007f800000;
                  auVar166._12_4_ = 0x7f800000;
                  auVar166._16_4_ = 0x7f800000;
                  auVar166._20_4_ = 0x7f800000;
                  auVar166._24_4_ = 0x7f800000;
                  auVar166._28_4_ = 0x7f800000;
                  auVar122 = vblendmps_avx512vl(auVar166,local_5a0);
                  auVar135._0_4_ =
                       (uint)(bVar93 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar135._4_4_ = (uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar135._8_4_ = (uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
                  auVar135._12_4_ = (uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
                  auVar135._16_4_ = (uint)bVar12 * auVar122._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
                  auVar135._20_4_ = (uint)bVar12 * auVar122._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
                  auVar135._24_4_ = (uint)bVar12 * auVar122._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar88 >> 7,0);
                  auVar135._28_4_ = (uint)bVar12 * auVar122._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar122 = vshufps_avx(auVar135,auVar135,0xb1);
                  auVar122 = vminps_avx(auVar135,auVar122);
                  auVar123 = vshufpd_avx(auVar122,auVar122,5);
                  auVar122 = vminps_avx(auVar122,auVar123);
                  auVar123 = vpermpd_avx2(auVar122,0x4e);
                  auVar122 = vminps_avx(auVar122,auVar123);
                  uVar32 = vcmpps_avx512vl(auVar135,auVar122,0);
                  uVar85 = (uint)uVar88;
                  if (((byte)uVar32 & bVar93) != 0) {
                    uVar85 = (uint)((byte)uVar32 & bVar93);
                  }
                  uVar86 = 0;
                  for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                    uVar86 = uVar86 + 1;
                  }
                  uVar84 = (ulong)uVar86;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar209 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar209);
                    auVar209 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar209);
                    local_840 = auVar113;
                    local_800 = local_5a0;
                    local_7e0 = pGVar91;
                    local_57c = iVar87;
                    local_570 = auVar98;
                    local_560 = uVar31;
                    uStack_558 = uVar76;
                    local_550 = uVar77;
                    uStack_548 = uVar78;
                    local_540 = uVar79;
                    uStack_538 = uVar80;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar84]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar84 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar84 * 4)
                      ;
                      local_880.context = context->user;
                      fVar173 = local_200._0_4_;
                      fVar179 = 1.0 - fVar173;
                      auVar97 = vfnmadd231ss_fma(ZEXT416((uint)(fVar173 * (fVar179 + fVar179))),
                                                 ZEXT416((uint)fVar179),ZEXT416((uint)fVar179));
                      auVar103 = local_200._0_16_;
                      auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar103,
                                                ZEXT416(0xc0a00000));
                      auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * 3.0)),
                                                 ZEXT416((uint)(fVar173 + fVar173)),auVar96);
                      auVar221 = ZEXT1664(auVar104);
                      auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar103,
                                                ZEXT416(0x40000000));
                      auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179 * -3.0)),
                                                ZEXT416((uint)(fVar179 + fVar179)),auVar96);
                      auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173)),auVar103,
                                                 ZEXT416((uint)(fVar179 * -2.0)));
                      fVar179 = auVar97._0_4_ * 0.5;
                      fVar173 = auVar104._0_4_ * 0.5;
                      fVar174 = auVar96._0_4_ * 0.5;
                      fVar175 = auVar103._0_4_ * 0.5;
                      auVar197._0_4_ = fVar175 * local_8c0;
                      auVar197._4_4_ = fVar175 * fStack_8bc;
                      auVar197._8_4_ = fVar175 * fStack_8b8;
                      auVar197._12_4_ = fVar175 * fStack_8b4;
                      auVar214._4_4_ = fVar174;
                      auVar214._0_4_ = fVar174;
                      auVar214._8_4_ = fVar174;
                      auVar214._12_4_ = fVar174;
                      auVar96 = vfmadd132ps_fma(auVar214,auVar197,auVar161);
                      auVar198._4_4_ = fVar173;
                      auVar198._0_4_ = fVar173;
                      auVar198._8_4_ = fVar173;
                      auVar198._12_4_ = fVar173;
                      auVar96 = vfmadd132ps_fma(auVar198,auVar96,auVar26);
                      auVar163._4_4_ = fVar179;
                      auVar163._0_4_ = fVar179;
                      auVar163._8_4_ = fVar179;
                      auVar163._12_4_ = fVar179;
                      auVar96 = vfmadd213ps_fma(auVar163,auVar98,auVar96);
                      auVar148 = vbroadcastss_avx512f(auVar96);
                      auVar209 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar209 = vpermps_avx512f(auVar209,ZEXT1664(auVar96));
                      auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar215,ZEXT1664(auVar96));
                      local_2c0[0] = (RTCHitN)auVar148[0];
                      local_2c0[1] = (RTCHitN)auVar148[1];
                      local_2c0[2] = (RTCHitN)auVar148[2];
                      local_2c0[3] = (RTCHitN)auVar148[3];
                      local_2c0[4] = (RTCHitN)auVar148[4];
                      local_2c0[5] = (RTCHitN)auVar148[5];
                      local_2c0[6] = (RTCHitN)auVar148[6];
                      local_2c0[7] = (RTCHitN)auVar148[7];
                      local_2c0[8] = (RTCHitN)auVar148[8];
                      local_2c0[9] = (RTCHitN)auVar148[9];
                      local_2c0[10] = (RTCHitN)auVar148[10];
                      local_2c0[0xb] = (RTCHitN)auVar148[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar148[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar148[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar148[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar148[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar148[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar148[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar148[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar148[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar148[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar148[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar148[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar148[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar148[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar148[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar148[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar148[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar148[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar148[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar148[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar148[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar148[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar148[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar148[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar148[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar148[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar148[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar148[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar148[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar148[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar148[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar148[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar148[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar148[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar148[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar148[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar148[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar148[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar148[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar148[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar148[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar148[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar148[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar148[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar148[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar148[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar148[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar148[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar148[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar148[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar148[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar148[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar148[0x3f];
                      local_280 = auVar209;
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar148 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar148);
                      auVar122 = vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                      local_850[3] = auVar122;
                      local_850[2] = auVar122;
                      local_850[1] = auVar122;
                      *local_850 = auVar122;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instPrimID[0]));
                      auVar148 = vmovdqa64_avx512f(local_300);
                      local_740 = vmovdqa64_avx512f(auVar148);
                      local_880.valid = (int *)local_740;
                      local_880.geometryUserPtr = pGVar91->userPtr;
                      local_880.hit = local_2c0;
                      local_880.N = 0x10;
                      local_780 = auVar237._0_32_;
                      local_880.ray = (RTCRayN *)ray;
                      if (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        auVar215 = ZEXT1664(auVar215._0_16_);
                        auVar221 = ZEXT1664(auVar104);
                        (*pGVar91->intersectionFilterN)(&local_880);
                        auVar227 = ZEXT3264(local_800);
                        auVar237 = ZEXT3264(local_780);
                        auVar238 = ZEXT3264(local_840);
                        auVar239 = ZEXT3264(local_7c0);
                        auVar172 = ZEXT3264(local_7a0);
                        auVar148 = vmovdqa64_avx512f(local_740);
                        pGVar91 = local_7e0;
                      }
                      uVar32 = vptestmd_avx512f(auVar148,auVar148);
                      if ((short)uVar32 == 0) {
LAB_01ada5f2:
                        *(int *)(ray + k * 4 + 0x200) = auVar237._0_4_;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar91->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          auVar221 = ZEXT1664(auVar221._0_16_);
                          (*p_Var11)(&local_880);
                          auVar227 = ZEXT3264(local_800);
                          auVar237 = ZEXT3264(local_780);
                          auVar238 = ZEXT3264(local_840);
                          auVar239 = ZEXT3264(local_7c0);
                          auVar172 = ZEXT3264(local_7a0);
                          auVar148 = vmovdqa64_avx512f(local_740);
                          pGVar91 = local_7e0;
                        }
                        uVar34 = vptestmd_avx512f(auVar148,auVar148);
                        if ((short)uVar34 == 0) goto LAB_01ada5f2;
                        iVar1 = *(int *)(local_880.hit + 4);
                        iVar2 = *(int *)(local_880.hit + 8);
                        iVar63 = *(int *)(local_880.hit + 0xc);
                        iVar64 = *(int *)(local_880.hit + 0x10);
                        iVar65 = *(int *)(local_880.hit + 0x14);
                        iVar66 = *(int *)(local_880.hit + 0x18);
                        iVar67 = *(int *)(local_880.hit + 0x1c);
                        iVar68 = *(int *)(local_880.hit + 0x20);
                        iVar69 = *(int *)(local_880.hit + 0x24);
                        iVar70 = *(int *)(local_880.hit + 0x28);
                        iVar71 = *(int *)(local_880.hit + 0x2c);
                        iVar72 = *(int *)(local_880.hit + 0x30);
                        iVar73 = *(int *)(local_880.hit + 0x34);
                        iVar74 = *(int *)(local_880.hit + 0x38);
                        iVar75 = *(int *)(local_880.hit + 0x3c);
                        bVar93 = (byte)uVar34;
                        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar83 = (byte)(uVar34 >> 8);
                        bVar19 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar25 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x300) =
                             (uint)(bVar93 & 1) * *(int *)local_880.hit |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x300);
                        *(uint *)(local_880.ray + 0x304) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_880.ray + 0x304);
                        *(uint *)(local_880.ray + 0x308) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_880.ray + 0x308);
                        *(uint *)(local_880.ray + 0x30c) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_880.ray + 0x30c)
                        ;
                        *(uint *)(local_880.ray + 0x310) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_880.ray + 0x310)
                        ;
                        *(uint *)(local_880.ray + 0x314) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_880.ray + 0x314)
                        ;
                        *(uint *)(local_880.ray + 0x318) =
                             (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_880.ray + 0x318)
                        ;
                        *(uint *)(local_880.ray + 0x31c) =
                             (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_880.ray + 0x31c)
                        ;
                        *(uint *)(local_880.ray + 800) =
                             (uint)(bVar83 & 1) * iVar68 |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 800);
                        *(uint *)(local_880.ray + 0x324) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_880.ray + 0x324)
                        ;
                        *(uint *)(local_880.ray + 0x328) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_880.ray + 0x328)
                        ;
                        *(uint *)(local_880.ray + 0x32c) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_880.ray + 0x32c)
                        ;
                        *(uint *)(local_880.ray + 0x330) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_880.ray + 0x330)
                        ;
                        *(uint *)(local_880.ray + 0x334) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_880.ray + 0x334)
                        ;
                        *(uint *)(local_880.ray + 0x338) =
                             (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_880.ray + 0x338)
                        ;
                        *(uint *)(local_880.ray + 0x33c) =
                             (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_880.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0x44);
                        iVar2 = *(int *)(local_880.hit + 0x48);
                        iVar63 = *(int *)(local_880.hit + 0x4c);
                        iVar64 = *(int *)(local_880.hit + 0x50);
                        iVar65 = *(int *)(local_880.hit + 0x54);
                        iVar66 = *(int *)(local_880.hit + 0x58);
                        iVar67 = *(int *)(local_880.hit + 0x5c);
                        iVar68 = *(int *)(local_880.hit + 0x60);
                        iVar69 = *(int *)(local_880.hit + 100);
                        iVar70 = *(int *)(local_880.hit + 0x68);
                        iVar71 = *(int *)(local_880.hit + 0x6c);
                        iVar72 = *(int *)(local_880.hit + 0x70);
                        iVar73 = *(int *)(local_880.hit + 0x74);
                        iVar74 = *(int *)(local_880.hit + 0x78);
                        iVar75 = *(int *)(local_880.hit + 0x7c);
                        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar25 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x340) =
                             (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0x40) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x340);
                        *(uint *)(local_880.ray + 0x344) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_880.ray + 0x344);
                        *(uint *)(local_880.ray + 0x348) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_880.ray + 0x348);
                        *(uint *)(local_880.ray + 0x34c) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_880.ray + 0x34c)
                        ;
                        *(uint *)(local_880.ray + 0x350) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_880.ray + 0x350)
                        ;
                        *(uint *)(local_880.ray + 0x354) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_880.ray + 0x354)
                        ;
                        *(uint *)(local_880.ray + 0x358) =
                             (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_880.ray + 0x358)
                        ;
                        *(uint *)(local_880.ray + 0x35c) =
                             (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_880.ray + 0x35c)
                        ;
                        *(uint *)(local_880.ray + 0x360) =
                             (uint)(bVar83 & 1) * iVar68 |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x360);
                        *(uint *)(local_880.ray + 0x364) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_880.ray + 0x364)
                        ;
                        *(uint *)(local_880.ray + 0x368) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_880.ray + 0x368)
                        ;
                        *(uint *)(local_880.ray + 0x36c) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_880.ray + 0x36c)
                        ;
                        *(uint *)(local_880.ray + 0x370) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_880.ray + 0x370)
                        ;
                        *(uint *)(local_880.ray + 0x374) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_880.ray + 0x374)
                        ;
                        *(uint *)(local_880.ray + 0x378) =
                             (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_880.ray + 0x378)
                        ;
                        *(uint *)(local_880.ray + 0x37c) =
                             (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_880.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0x84);
                        iVar2 = *(int *)(local_880.hit + 0x88);
                        iVar63 = *(int *)(local_880.hit + 0x8c);
                        iVar64 = *(int *)(local_880.hit + 0x90);
                        iVar65 = *(int *)(local_880.hit + 0x94);
                        iVar66 = *(int *)(local_880.hit + 0x98);
                        iVar67 = *(int *)(local_880.hit + 0x9c);
                        iVar68 = *(int *)(local_880.hit + 0xa0);
                        iVar69 = *(int *)(local_880.hit + 0xa4);
                        iVar70 = *(int *)(local_880.hit + 0xa8);
                        iVar71 = *(int *)(local_880.hit + 0xac);
                        iVar72 = *(int *)(local_880.hit + 0xb0);
                        iVar73 = *(int *)(local_880.hit + 0xb4);
                        iVar74 = *(int *)(local_880.hit + 0xb8);
                        iVar75 = *(int *)(local_880.hit + 0xbc);
                        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar25 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x380) =
                             (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0x80) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x380);
                        *(uint *)(local_880.ray + 900) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_880.ray + 900);
                        *(uint *)(local_880.ray + 0x388) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_880.ray + 0x388);
                        *(uint *)(local_880.ray + 0x38c) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_880.ray + 0x38c)
                        ;
                        *(uint *)(local_880.ray + 0x390) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_880.ray + 0x390)
                        ;
                        *(uint *)(local_880.ray + 0x394) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_880.ray + 0x394)
                        ;
                        *(uint *)(local_880.ray + 0x398) =
                             (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_880.ray + 0x398)
                        ;
                        *(uint *)(local_880.ray + 0x39c) =
                             (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_880.ray + 0x39c)
                        ;
                        *(uint *)(local_880.ray + 0x3a0) =
                             (uint)(bVar83 & 1) * iVar68 |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x3a0);
                        *(uint *)(local_880.ray + 0x3a4) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_880.ray + 0x3a4)
                        ;
                        *(uint *)(local_880.ray + 0x3a8) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_880.ray + 0x3a8)
                        ;
                        *(uint *)(local_880.ray + 0x3ac) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_880.ray + 0x3ac)
                        ;
                        *(uint *)(local_880.ray + 0x3b0) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_880.ray + 0x3b0)
                        ;
                        *(uint *)(local_880.ray + 0x3b4) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_880.ray + 0x3b4)
                        ;
                        *(uint *)(local_880.ray + 0x3b8) =
                             (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_880.ray + 0x3b8)
                        ;
                        *(uint *)(local_880.ray + 0x3bc) =
                             (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_880.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0xc4);
                        iVar2 = *(int *)(local_880.hit + 200);
                        iVar63 = *(int *)(local_880.hit + 0xcc);
                        iVar64 = *(int *)(local_880.hit + 0xd0);
                        iVar65 = *(int *)(local_880.hit + 0xd4);
                        iVar66 = *(int *)(local_880.hit + 0xd8);
                        iVar67 = *(int *)(local_880.hit + 0xdc);
                        iVar68 = *(int *)(local_880.hit + 0xe0);
                        iVar69 = *(int *)(local_880.hit + 0xe4);
                        iVar70 = *(int *)(local_880.hit + 0xe8);
                        iVar71 = *(int *)(local_880.hit + 0xec);
                        iVar72 = *(int *)(local_880.hit + 0xf0);
                        iVar73 = *(int *)(local_880.hit + 0xf4);
                        iVar74 = *(int *)(local_880.hit + 0xf8);
                        iVar75 = *(int *)(local_880.hit + 0xfc);
                        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar25 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x3c0) =
                             (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0xc0) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x3c0);
                        *(uint *)(local_880.ray + 0x3c4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_880.ray + 0x3c4);
                        *(uint *)(local_880.ray + 0x3c8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_880.ray + 0x3c8);
                        *(uint *)(local_880.ray + 0x3cc) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_880.ray + 0x3cc)
                        ;
                        *(uint *)(local_880.ray + 0x3d0) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_880.ray + 0x3d0)
                        ;
                        *(uint *)(local_880.ray + 0x3d4) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_880.ray + 0x3d4)
                        ;
                        *(uint *)(local_880.ray + 0x3d8) =
                             (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_880.ray + 0x3d8)
                        ;
                        *(uint *)(local_880.ray + 0x3dc) =
                             (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_880.ray + 0x3dc)
                        ;
                        *(uint *)(local_880.ray + 0x3e0) =
                             (uint)(bVar83 & 1) * iVar68 |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x3e0);
                        *(uint *)(local_880.ray + 0x3e4) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_880.ray + 0x3e4)
                        ;
                        *(uint *)(local_880.ray + 1000) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_880.ray + 1000);
                        *(uint *)(local_880.ray + 0x3ec) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_880.ray + 0x3ec)
                        ;
                        *(uint *)(local_880.ray + 0x3f0) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_880.ray + 0x3f0)
                        ;
                        *(uint *)(local_880.ray + 0x3f4) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_880.ray + 0x3f4)
                        ;
                        *(uint *)(local_880.ray + 0x3f8) =
                             (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_880.ray + 0x3f8)
                        ;
                        *(uint *)(local_880.ray + 0x3fc) =
                             (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_880.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_880.hit + 0x104);
                        iVar2 = *(int *)(local_880.hit + 0x108);
                        iVar63 = *(int *)(local_880.hit + 0x10c);
                        iVar64 = *(int *)(local_880.hit + 0x110);
                        iVar65 = *(int *)(local_880.hit + 0x114);
                        iVar66 = *(int *)(local_880.hit + 0x118);
                        iVar67 = *(int *)(local_880.hit + 0x11c);
                        iVar68 = *(int *)(local_880.hit + 0x120);
                        iVar69 = *(int *)(local_880.hit + 0x124);
                        iVar70 = *(int *)(local_880.hit + 0x128);
                        iVar71 = *(int *)(local_880.hit + 300);
                        iVar72 = *(int *)(local_880.hit + 0x130);
                        iVar73 = *(int *)(local_880.hit + 0x134);
                        iVar74 = *(int *)(local_880.hit + 0x138);
                        iVar75 = *(int *)(local_880.hit + 0x13c);
                        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar25 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_880.ray + 0x400) =
                             (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0x100) |
                             (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x400);
                        *(uint *)(local_880.ray + 0x404) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_880.ray + 0x404);
                        *(uint *)(local_880.ray + 0x408) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_880.ray + 0x408);
                        *(uint *)(local_880.ray + 0x40c) =
                             (uint)bVar14 * iVar63 | (uint)!bVar14 * *(int *)(local_880.ray + 0x40c)
                        ;
                        *(uint *)(local_880.ray + 0x410) =
                             (uint)bVar15 * iVar64 | (uint)!bVar15 * *(int *)(local_880.ray + 0x410)
                        ;
                        *(uint *)(local_880.ray + 0x414) =
                             (uint)bVar16 * iVar65 | (uint)!bVar16 * *(int *)(local_880.ray + 0x414)
                        ;
                        *(uint *)(local_880.ray + 0x418) =
                             (uint)bVar17 * iVar66 | (uint)!bVar17 * *(int *)(local_880.ray + 0x418)
                        ;
                        *(uint *)(local_880.ray + 0x41c) =
                             (uint)bVar18 * iVar67 | (uint)!bVar18 * *(int *)(local_880.ray + 0x41c)
                        ;
                        *(uint *)(local_880.ray + 0x420) =
                             (uint)(bVar83 & 1) * iVar68 |
                             (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x420);
                        *(uint *)(local_880.ray + 0x424) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_880.ray + 0x424)
                        ;
                        *(uint *)(local_880.ray + 0x428) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_880.ray + 0x428)
                        ;
                        *(uint *)(local_880.ray + 0x42c) =
                             (uint)bVar21 * iVar71 | (uint)!bVar21 * *(int *)(local_880.ray + 0x42c)
                        ;
                        *(uint *)(local_880.ray + 0x430) =
                             (uint)bVar22 * iVar72 | (uint)!bVar22 * *(int *)(local_880.ray + 0x430)
                        ;
                        *(uint *)(local_880.ray + 0x434) =
                             (uint)bVar23 * iVar73 | (uint)!bVar23 * *(int *)(local_880.ray + 0x434)
                        ;
                        *(uint *)(local_880.ray + 0x438) =
                             (uint)bVar24 * iVar74 | (uint)!bVar24 * *(int *)(local_880.ray + 0x438)
                        ;
                        *(uint *)(local_880.ray + 0x43c) =
                             (uint)bVar25 * iVar75 | (uint)!bVar25 * *(int *)(local_880.ray + 0x43c)
                        ;
                        auVar237 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x140));
                        auVar237 = vmovdqu32_avx512f(auVar237);
                        *(undefined1 (*) [64])(local_880.ray + 0x440) = auVar237;
                        auVar237 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x180));
                        auVar237 = vmovdqu32_avx512f(auVar237);
                        *(undefined1 (*) [64])(local_880.ray + 0x480) = auVar237;
                        auVar237 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x1c0));
                        auVar237 = vmovdqa32_avx512f(auVar237);
                        *(undefined1 (*) [64])(local_880.ray + 0x4c0) = auVar237;
                        auVar237 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x200));
                        auVar237 = vmovdqa32_avx512f(auVar237);
                        *(undefined1 (*) [64])(local_880.ray + 0x500) = auVar237;
                        auVar237 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      auVar113 = auVar238._0_32_;
                      bVar93 = ~(byte)(1 << ((uint)uVar84 & 0x1f)) & (byte)uVar88;
                      uVar158 = auVar237._0_4_;
                      auVar170._4_4_ = uVar158;
                      auVar170._0_4_ = uVar158;
                      auVar170._8_4_ = uVar158;
                      auVar170._12_4_ = uVar158;
                      auVar170._16_4_ = uVar158;
                      auVar170._20_4_ = uVar158;
                      auVar170._24_4_ = uVar158;
                      auVar170._28_4_ = uVar158;
                      uVar32 = vcmpps_avx512vl(auVar227._0_32_,auVar170,2);
                      if ((bVar93 & (byte)uVar32) == 0) goto LAB_01ad940e;
                      bVar93 = bVar93 & (byte)uVar32;
                      uVar88 = (ulong)bVar93;
                      auVar171._8_4_ = 0x7f800000;
                      auVar171._0_8_ = 0x7f8000007f800000;
                      auVar171._12_4_ = 0x7f800000;
                      auVar171._16_4_ = 0x7f800000;
                      auVar171._20_4_ = 0x7f800000;
                      auVar171._24_4_ = 0x7f800000;
                      auVar171._28_4_ = 0x7f800000;
                      auVar122 = vblendmps_avx512vl(auVar171,auVar227._0_32_);
                      auVar113._0_4_ =
                           (uint)(bVar93 & 1) * auVar122._0_4_ |
                           (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                      bVar12 = (bool)(bVar93 >> 1 & 1);
                      auVar113._4_4_ = (uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar93 >> 2 & 1);
                      auVar113._8_4_ = (uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar93 >> 3 & 1);
                      auVar113._12_4_ = (uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar93 >> 4 & 1);
                      auVar113._16_4_ = (uint)bVar12 * auVar122._16_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar93 >> 5 & 1);
                      auVar113._20_4_ = (uint)bVar12 * auVar122._20_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar93 >> 6 & 1);
                      auVar113._24_4_ = (uint)bVar12 * auVar122._24_4_ | (uint)!bVar12 * 0x7f800000;
                      auVar113._28_4_ =
                           (uint)(bVar93 >> 7) * auVar122._28_4_ |
                           (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                      auVar122 = vshufps_avx(auVar113,auVar113,0xb1);
                      auVar122 = vminps_avx(auVar113,auVar122);
                      auVar123 = vshufpd_avx(auVar122,auVar122,5);
                      auVar122 = vminps_avx(auVar122,auVar123);
                      auVar123 = vpermpd_avx2(auVar122,0x4e);
                      auVar122 = vminps_avx(auVar122,auVar123);
                      uVar32 = vcmpps_avx512vl(auVar113,auVar122,0);
                      bVar83 = (byte)uVar32 & bVar93;
                      if (bVar83 != 0) {
                        bVar93 = bVar83;
                      }
                      uVar85 = 0;
                      for (uVar86 = (uint)bVar93; (uVar86 & 1) == 0;
                          uVar86 = uVar86 >> 1 | 0x80000000) {
                        uVar85 = uVar85 + 1;
                      }
                      uVar84 = (ulong)uVar85;
                    } while( true );
                  }
                  fVar179 = local_520[uVar84];
                  uVar158 = *(undefined4 *)(local_500 + uVar84 * 4);
                  fVar173 = 1.0 - fVar179;
                  auVar26 = vfnmadd231ss_fma(ZEXT416((uint)(fVar179 * (fVar173 + fVar173))),
                                             ZEXT416((uint)fVar173),ZEXT416((uint)fVar173));
                  auVar161 = ZEXT416((uint)fVar179);
                  auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                            ZEXT416(0xc0a00000));
                  auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179 * 3.0)),
                                             ZEXT416((uint)(fVar179 + fVar179)),auVar96);
                  auVar221 = ZEXT1664(auVar104);
                  auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                            ZEXT416(0x40000000));
                  auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * -3.0)),
                                            ZEXT416((uint)(fVar173 + fVar173)),auVar96);
                  auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),auVar161,
                                             ZEXT416((uint)(fVar173 * -2.0)));
                  fVar173 = auVar26._0_4_ * 0.5;
                  fVar174 = auVar104._0_4_ * 0.5;
                  auVar209 = ZEXT464((uint)fVar174);
                  fVar175 = auVar96._0_4_ * 0.5;
                  fVar186 = auVar161._0_4_ * 0.5;
                  auVar191._0_4_ = fVar186 * local_8c0;
                  auVar191._4_4_ = fVar186 * fStack_8bc;
                  auVar191._8_4_ = fVar186 * fStack_8b8;
                  auVar191._12_4_ = fVar186 * fStack_8b4;
                  auVar211._4_4_ = fVar175;
                  auVar211._0_4_ = fVar175;
                  auVar211._8_4_ = fVar175;
                  auVar211._12_4_ = fVar175;
                  auVar96 = vfmadd132ps_fma(auVar211,auVar191,*pauVar4);
                  auVar215 = ZEXT1664(auVar96);
                  auVar192._4_4_ = fVar174;
                  auVar192._0_4_ = fVar174;
                  auVar192._8_4_ = fVar174;
                  auVar192._12_4_ = fVar174;
                  auVar96 = vfmadd132ps_fma(auVar192,auVar96,*pauVar3);
                  auVar182._4_4_ = fVar173;
                  auVar182._0_4_ = fVar173;
                  auVar182._8_4_ = fVar173;
                  auVar182._12_4_ = fVar173;
                  auVar96 = vfmadd213ps_fma(auVar182,auVar98,auVar96);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar84 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar96._0_4_;
                  uVar10 = vextractps_avx(auVar96,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                  uVar10 = vextractps_avx(auVar96,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar179;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar158;
                  *(uint *)(ray + k * 4 + 0x440) = uVar9;
                  *(uint *)(ray + k * 4 + 0x480) = uVar89;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01ad940e:
      if (8 < iVar87) {
        auVar122 = vpbroadcastd_avx512vl();
        auVar227 = ZEXT3264(auVar122);
        local_780._4_4_ = local_820._0_4_;
        local_780._0_4_ = local_820._0_4_;
        local_780._8_4_ = local_820._0_4_;
        local_780._12_4_ = local_820._0_4_;
        local_780._16_4_ = local_820._0_4_;
        local_780._20_4_ = local_820._0_4_;
        local_780._24_4_ = local_820._0_4_;
        local_780._28_4_ = local_820._0_4_;
        uStack_75c = local_760;
        uStack_758 = local_760;
        uStack_754 = local_760;
        uStack_750 = local_760;
        uStack_74c = local_760;
        uStack_748 = local_760;
        uStack_744 = local_760;
        fStack_7d8 = 1.0 / (float)local_440._0_4_;
        auVar238 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar238);
        auVar238 = vpbroadcastd_avx512f();
        local_400 = vmovdqa64_avx512f(auVar238);
        lVar90 = 8;
        local_840 = auVar113;
        fStack_7d4 = fStack_7d8;
        fStack_7d0 = fStack_7d8;
        fStack_7cc = fStack_7d8;
        fStack_7c8 = fStack_7d8;
        fStack_7c4 = fStack_7d8;
        local_7e0._0_4_ = fStack_7d8;
        local_7e0._4_4_ = fStack_7d8;
LAB_01ad94b9:
        auVar122 = vpbroadcastd_avx512vl();
        auVar122 = vpor_avx2(auVar122,_DAT_01fe9900);
        uVar33 = vpcmpgtd_avx512vl(auVar227._0_32_,auVar122);
        auVar122 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar90 * 4 + lVar35);
        auVar123 = *(undefined1 (*) [32])(lVar35 + 0x21b37f0 + lVar90 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar35 + 0x21b3c74 + lVar90 * 4);
        auVar119 = *(undefined1 (*) [32])(lVar35 + 0x21b40f8 + lVar90 * 4);
        auVar238._0_4_ = auVar119._0_4_ * (float)local_6c0._0_4_;
        auVar238._4_4_ = auVar119._4_4_ * (float)local_6c0._4_4_;
        auVar238._8_4_ = auVar119._8_4_ * fStack_6b8;
        auVar238._12_4_ = auVar119._12_4_ * fStack_6b4;
        auVar238._16_4_ = auVar119._16_4_ * fStack_6b0;
        auVar238._20_4_ = auVar119._20_4_ * fStack_6ac;
        auVar238._28_36_ = auVar215._28_36_;
        auVar238._24_4_ = auVar119._24_4_ * fStack_6a8;
        auVar215._0_4_ = auVar119._0_4_ * (float)local_6e0._0_4_;
        auVar215._4_4_ = auVar119._4_4_ * (float)local_6e0._4_4_;
        auVar215._8_4_ = auVar119._8_4_ * fStack_6d8;
        auVar215._12_4_ = auVar119._12_4_ * fStack_6d4;
        auVar215._16_4_ = auVar119._16_4_ * fStack_6d0;
        auVar215._20_4_ = auVar119._20_4_ * fStack_6cc;
        auVar215._28_36_ = auVar209._28_36_;
        auVar215._24_4_ = auVar119._24_4_ * fStack_6c8;
        auVar106 = vmulps_avx512vl(local_380,auVar119);
        local_7a0 = auVar172._0_32_;
        auVar107 = vfmadd231ps_avx512vl(auVar238._0_32_,auVar120,local_680);
        auVar108 = vfmadd231ps_avx512vl(auVar215._0_32_,auVar120,local_6a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar120,local_360);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar123,local_640);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,local_660);
        auVar118 = vfmadd231ps_avx512vl(auVar106,auVar123,local_340);
        auVar96 = vfmadd231ps_fma(auVar107,auVar122,local_600);
        auVar215 = ZEXT1664(auVar96);
        auVar104 = vfmadd231ps_fma(auVar108,auVar122,local_620);
        auVar209 = ZEXT1664(auVar104);
        auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar90 * 4 + lVar35);
        auVar107 = *(undefined1 (*) [32])(lVar35 + 0x21b5c10 + lVar90 * 4);
        auVar111 = vfmadd231ps_avx512vl(auVar118,auVar122,local_320);
        auVar108 = *(undefined1 (*) [32])(lVar35 + 0x21b6094 + lVar90 * 4);
        auVar118 = *(undefined1 (*) [32])(lVar35 + 0x21b6518 + lVar90 * 4);
        auVar172._0_4_ = auVar118._0_4_ * (float)local_6c0._0_4_;
        auVar172._4_4_ = auVar118._4_4_ * (float)local_6c0._4_4_;
        auVar172._8_4_ = auVar118._8_4_ * fStack_6b8;
        auVar172._12_4_ = auVar118._12_4_ * fStack_6b4;
        auVar172._16_4_ = auVar118._16_4_ * fStack_6b0;
        auVar172._20_4_ = auVar118._20_4_ * fStack_6ac;
        auVar172._28_36_ = auVar221._28_36_;
        auVar172._24_4_ = auVar118._24_4_ * fStack_6a8;
        auVar46._4_4_ = auVar118._4_4_ * (float)local_6e0._4_4_;
        auVar46._0_4_ = auVar118._0_4_ * (float)local_6e0._0_4_;
        auVar46._8_4_ = auVar118._8_4_ * fStack_6d8;
        auVar46._12_4_ = auVar118._12_4_ * fStack_6d4;
        auVar46._16_4_ = auVar118._16_4_ * fStack_6d0;
        auVar46._20_4_ = auVar118._20_4_ * fStack_6cc;
        auVar46._24_4_ = auVar118._24_4_ * fStack_6c8;
        auVar46._28_4_ = uStack_6c4;
        auVar109 = vmulps_avx512vl(local_380,auVar118);
        auVar110 = vfmadd231ps_avx512vl(auVar172._0_32_,auVar108,local_680);
        auVar172 = ZEXT3264(local_7a0);
        auVar112 = vfmadd231ps_avx512vl(auVar46,auVar108,local_6a0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar108,local_360);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,local_640);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_660);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,local_340);
        auVar161 = vfmadd231ps_fma(auVar110,auVar106,local_600);
        auVar221 = ZEXT1664(auVar161);
        auVar26 = vfmadd231ps_fma(auVar112,auVar106,local_620);
        auVar112 = vfmadd231ps_avx512vl(auVar109,auVar106,local_320);
        auVar113 = vmaxps_avx512vl(auVar111,auVar112);
        auVar109 = vsubps_avx(ZEXT1632(auVar161),ZEXT1632(auVar96));
        auVar110 = vsubps_avx(ZEXT1632(auVar26),ZEXT1632(auVar104));
        auVar114 = vmulps_avx512vl(ZEXT1632(auVar104),auVar109);
        auVar115 = vmulps_avx512vl(ZEXT1632(auVar96),auVar110);
        auVar114 = vsubps_avx512vl(auVar114,auVar115);
        auVar115 = vmulps_avx512vl(auVar110,auVar110);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar109,auVar109);
        auVar113 = vmulps_avx512vl(auVar113,auVar113);
        auVar113 = vmulps_avx512vl(auVar113,auVar115);
        auVar114 = vmulps_avx512vl(auVar114,auVar114);
        uVar32 = vcmpps_avx512vl(auVar114,auVar113,2);
        bVar93 = (byte)uVar33 & (byte)uVar32;
        if (bVar93 != 0) {
          auVar118 = vmulps_avx512vl(local_4a0,auVar118);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_840,auVar118);
          local_7c0 = auVar239._0_32_;
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_7c0,auVar108);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_7a0,auVar107);
          auVar119 = vmulps_avx512vl(local_4a0,auVar119);
          auVar120 = vfmadd213ps_avx512vl(auVar120,local_840,auVar119);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_7c0,auVar120);
          auVar107 = vfmadd213ps_avx512vl(auVar122,local_7a0,auVar123);
          auVar122 = *(undefined1 (*) [32])(lVar35 + 0x21b457c + lVar90 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar35 + 0x21b4a00 + lVar90 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar35 + 0x21b4e84 + lVar90 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar35 + 0x21b5308 + lVar90 * 4);
          auVar108 = vmulps_avx512vl(_local_6c0,auVar119);
          auVar118 = vmulps_avx512vl(_local_6e0,auVar119);
          auVar119 = vmulps_avx512vl(local_4a0,auVar119);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,local_680);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar120,local_6a0);
          auVar103 = vfmadd231ps_fma(auVar119,auVar120,local_840);
          auVar120 = vfmadd231ps_avx512vl(auVar108,auVar123,local_640);
          auVar119 = vfmadd231ps_avx512vl(auVar118,auVar123,local_660);
          auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),local_7c0,auVar123);
          auVar108 = vfmadd231ps_avx512vl(auVar120,auVar122,local_600);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_620);
          auVar118 = vfmadd231ps_avx512vl(auVar123,local_7a0,auVar122);
          auVar122 = *(undefined1 (*) [32])(lVar35 + 0x21b699c + lVar90 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar35 + 0x21b72a4 + lVar90 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar35 + 0x21b7728 + lVar90 * 4);
          auVar113 = vmulps_avx512vl(_local_6c0,auVar120);
          auVar114 = vmulps_avx512vl(_local_6e0,auVar120);
          auVar120 = vmulps_avx512vl(local_4a0,auVar120);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,local_680);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_6a0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,local_840,auVar123);
          auVar123 = *(undefined1 (*) [32])(lVar35 + 0x21b6e20 + lVar90 * 4);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,local_640);
          auVar172 = ZEXT3264(local_7a0);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_660);
          auVar123 = vfmadd231ps_avx512vl(auVar120,local_7c0,auVar123);
          auVar120 = vfmadd231ps_avx512vl(auVar113,auVar122,local_600);
          auVar113 = vfmadd231ps_avx512vl(auVar114,auVar122,local_620);
          auVar123 = vfmadd231ps_avx512vl(auVar123,local_7a0,auVar122);
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar108,auVar114);
          vandps_avx512vl(auVar119,auVar114);
          auVar122 = vmaxps_avx(auVar114,auVar114);
          vandps_avx512vl(auVar118,auVar114);
          auVar122 = vmaxps_avx(auVar122,auVar114);
          uVar84 = vcmpps_avx512vl(auVar122,local_780,1);
          bVar12 = (bool)((byte)uVar84 & 1);
          auVar136._0_4_ = (float)((uint)bVar12 * auVar109._0_4_ | (uint)!bVar12 * auVar108._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar108._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar108._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar108._12_4_);
          bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar136._16_4_ =
               (float)((uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * auVar108._16_4_);
          bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar136._20_4_ =
               (float)((uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * auVar108._20_4_);
          bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar136._24_4_ =
               (float)((uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * auVar108._24_4_);
          bVar12 = SUB81(uVar84 >> 7,0);
          auVar136._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * auVar108._28_4_;
          bVar12 = (bool)((byte)uVar84 & 1);
          auVar137._0_4_ = (float)((uint)bVar12 * auVar110._0_4_ | (uint)!bVar12 * auVar119._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar119._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar119._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar137._12_4_ =
               (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar119._12_4_);
          bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar137._16_4_ =
               (float)((uint)bVar12 * auVar110._16_4_ | (uint)!bVar12 * auVar119._16_4_);
          bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar137._20_4_ =
               (float)((uint)bVar12 * auVar110._20_4_ | (uint)!bVar12 * auVar119._20_4_);
          bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar137._24_4_ =
               (float)((uint)bVar12 * auVar110._24_4_ | (uint)!bVar12 * auVar119._24_4_);
          bVar12 = SUB81(uVar84 >> 7,0);
          auVar137._28_4_ = (uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar119._28_4_;
          vandps_avx512vl(auVar120,auVar114);
          vandps_avx512vl(auVar113,auVar114);
          auVar122 = vmaxps_avx(auVar137,auVar137);
          vandps_avx512vl(auVar123,auVar114);
          auVar122 = vmaxps_avx(auVar122,auVar137);
          uVar84 = vcmpps_avx512vl(auVar122,local_780,1);
          bVar12 = (bool)((byte)uVar84 & 1);
          auVar138._0_4_ = (uint)bVar12 * auVar109._0_4_ | (uint)!bVar12 * auVar120._0_4_;
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar120._4_4_;
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar120._8_4_;
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar120._12_4_;
          bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar138._16_4_ = (uint)bVar12 * auVar109._16_4_ | (uint)!bVar12 * auVar120._16_4_;
          bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar138._20_4_ = (uint)bVar12 * auVar109._20_4_ | (uint)!bVar12 * auVar120._20_4_;
          bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar138._24_4_ = (uint)bVar12 * auVar109._24_4_ | (uint)!bVar12 * auVar120._24_4_;
          bVar12 = SUB81(uVar84 >> 7,0);
          auVar138._28_4_ = (uint)bVar12 * auVar109._28_4_ | (uint)!bVar12 * auVar120._28_4_;
          bVar12 = (bool)((byte)uVar84 & 1);
          auVar139._0_4_ = (float)((uint)bVar12 * auVar110._0_4_ | (uint)!bVar12 * auVar113._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar113._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar113._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar113._12_4_);
          bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
          auVar139._16_4_ =
               (float)((uint)bVar12 * auVar110._16_4_ | (uint)!bVar12 * auVar113._16_4_);
          bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
          auVar139._20_4_ =
               (float)((uint)bVar12 * auVar110._20_4_ | (uint)!bVar12 * auVar113._20_4_);
          bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
          auVar139._24_4_ =
               (float)((uint)bVar12 * auVar110._24_4_ | (uint)!bVar12 * auVar113._24_4_);
          bVar12 = SUB81(uVar84 >> 7,0);
          auVar139._28_4_ = (uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar113._28_4_;
          auVar225._8_4_ = 0x80000000;
          auVar225._0_8_ = 0x8000000080000000;
          auVar225._12_4_ = 0x80000000;
          auVar225._16_4_ = 0x80000000;
          auVar225._20_4_ = 0x80000000;
          auVar225._24_4_ = 0x80000000;
          auVar225._28_4_ = 0x80000000;
          auVar122 = vxorps_avx512vl(auVar138,auVar225);
          auVar105 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
          auVar123 = vfmadd213ps_avx512vl(auVar136,auVar136,ZEXT1632(auVar105));
          auVar103 = vfmadd231ps_fma(auVar123,auVar137,auVar137);
          auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar103));
          auVar235._8_4_ = 0xbf000000;
          auVar235._0_8_ = 0xbf000000bf000000;
          auVar235._12_4_ = 0xbf000000;
          auVar235._16_4_ = 0xbf000000;
          auVar235._20_4_ = 0xbf000000;
          auVar235._24_4_ = 0xbf000000;
          auVar235._28_4_ = 0xbf000000;
          fVar179 = auVar123._0_4_;
          fVar173 = auVar123._4_4_;
          fVar174 = auVar123._8_4_;
          fVar175 = auVar123._12_4_;
          fVar186 = auVar123._16_4_;
          fVar202 = auVar123._20_4_;
          fVar94 = auVar123._24_4_;
          auVar47._4_4_ = fVar173 * fVar173 * fVar173 * auVar103._4_4_ * -0.5;
          auVar47._0_4_ = fVar179 * fVar179 * fVar179 * auVar103._0_4_ * -0.5;
          auVar47._8_4_ = fVar174 * fVar174 * fVar174 * auVar103._8_4_ * -0.5;
          auVar47._12_4_ = fVar175 * fVar175 * fVar175 * auVar103._12_4_ * -0.5;
          auVar47._16_4_ = fVar186 * fVar186 * fVar186 * -0.0;
          auVar47._20_4_ = fVar202 * fVar202 * fVar202 * -0.0;
          auVar47._24_4_ = fVar94 * fVar94 * fVar94 * -0.0;
          auVar47._28_4_ = auVar137._28_4_;
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar123 = vfmadd231ps_avx512vl(auVar47,auVar120,auVar123);
          auVar48._4_4_ = auVar137._4_4_ * auVar123._4_4_;
          auVar48._0_4_ = auVar137._0_4_ * auVar123._0_4_;
          auVar48._8_4_ = auVar137._8_4_ * auVar123._8_4_;
          auVar48._12_4_ = auVar137._12_4_ * auVar123._12_4_;
          auVar48._16_4_ = auVar137._16_4_ * auVar123._16_4_;
          auVar48._20_4_ = auVar137._20_4_ * auVar123._20_4_;
          auVar48._24_4_ = auVar137._24_4_ * auVar123._24_4_;
          auVar48._28_4_ = 0;
          auVar49._4_4_ = auVar123._4_4_ * -auVar136._4_4_;
          auVar49._0_4_ = auVar123._0_4_ * -auVar136._0_4_;
          auVar49._8_4_ = auVar123._8_4_ * -auVar136._8_4_;
          auVar49._12_4_ = auVar123._12_4_ * -auVar136._12_4_;
          auVar49._16_4_ = auVar123._16_4_ * -auVar136._16_4_;
          auVar49._20_4_ = auVar123._20_4_ * -auVar136._20_4_;
          auVar49._24_4_ = auVar123._24_4_ * -auVar136._24_4_;
          auVar49._28_4_ = auVar137._28_4_;
          auVar119 = vmulps_avx512vl(auVar123,ZEXT1632(auVar105));
          auVar118 = ZEXT1632(auVar105);
          auVar123 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar118);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar139,auVar139);
          auVar108 = vrsqrt14ps_avx512vl(auVar123);
          auVar123 = vmulps_avx512vl(auVar123,auVar235);
          fVar179 = auVar108._0_4_;
          fVar173 = auVar108._4_4_;
          fVar174 = auVar108._8_4_;
          fVar175 = auVar108._12_4_;
          fVar186 = auVar108._16_4_;
          fVar202 = auVar108._20_4_;
          fVar94 = auVar108._24_4_;
          auVar50._4_4_ = fVar173 * fVar173 * fVar173 * auVar123._4_4_;
          auVar50._0_4_ = fVar179 * fVar179 * fVar179 * auVar123._0_4_;
          auVar50._8_4_ = fVar174 * fVar174 * fVar174 * auVar123._8_4_;
          auVar50._12_4_ = fVar175 * fVar175 * fVar175 * auVar123._12_4_;
          auVar50._16_4_ = fVar186 * fVar186 * fVar186 * auVar123._16_4_;
          auVar50._20_4_ = fVar202 * fVar202 * fVar202 * auVar123._20_4_;
          auVar50._24_4_ = fVar94 * fVar94 * fVar94 * auVar123._24_4_;
          auVar50._28_4_ = auVar123._28_4_;
          auVar123 = vfmadd231ps_avx512vl(auVar50,auVar120,auVar108);
          auVar51._4_4_ = auVar139._4_4_ * auVar123._4_4_;
          auVar51._0_4_ = auVar139._0_4_ * auVar123._0_4_;
          auVar51._8_4_ = auVar139._8_4_ * auVar123._8_4_;
          auVar51._12_4_ = auVar139._12_4_ * auVar123._12_4_;
          auVar51._16_4_ = auVar139._16_4_ * auVar123._16_4_;
          auVar51._20_4_ = auVar139._20_4_ * auVar123._20_4_;
          auVar51._24_4_ = auVar139._24_4_ * auVar123._24_4_;
          auVar51._28_4_ = auVar108._28_4_;
          auVar52._4_4_ = auVar123._4_4_ * auVar122._4_4_;
          auVar52._0_4_ = auVar123._0_4_ * auVar122._0_4_;
          auVar52._8_4_ = auVar123._8_4_ * auVar122._8_4_;
          auVar52._12_4_ = auVar123._12_4_ * auVar122._12_4_;
          auVar52._16_4_ = auVar123._16_4_ * auVar122._16_4_;
          auVar52._20_4_ = auVar123._20_4_ * auVar122._20_4_;
          auVar52._24_4_ = auVar123._24_4_ * auVar122._24_4_;
          auVar52._28_4_ = auVar122._28_4_;
          auVar122 = vmulps_avx512vl(auVar123,auVar118);
          auVar103 = vfmadd213ps_fma(auVar48,auVar111,ZEXT1632(auVar96));
          auVar97 = vfmadd213ps_fma(auVar49,auVar111,ZEXT1632(auVar104));
          auVar120 = vfmadd213ps_avx512vl(auVar119,auVar111,auVar107);
          auVar108 = vfmadd213ps_avx512vl(auVar51,auVar112,ZEXT1632(auVar161));
          auVar99 = vfnmadd213ps_fma(auVar48,auVar111,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar52,auVar112,ZEXT1632(auVar26));
          auVar159 = vfnmadd213ps_fma(auVar49,auVar111,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar122,auVar112,auVar106);
          auVar101 = vfnmadd231ps_fma(auVar107,auVar111,auVar119);
          auVar160 = vfnmadd213ps_fma(auVar51,auVar112,ZEXT1632(auVar161));
          auVar100 = vfnmadd213ps_fma(auVar52,auVar112,ZEXT1632(auVar26));
          auVar176 = vfnmadd231ps_fma(auVar106,auVar112,auVar122);
          auVar106 = vsubps_avx512vl(auVar108,ZEXT1632(auVar99));
          auVar122 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar159));
          auVar123 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar101));
          auVar53._4_4_ = auVar122._4_4_ * auVar101._4_4_;
          auVar53._0_4_ = auVar122._0_4_ * auVar101._0_4_;
          auVar53._8_4_ = auVar122._8_4_ * auVar101._8_4_;
          auVar53._12_4_ = auVar122._12_4_ * auVar101._12_4_;
          auVar53._16_4_ = auVar122._16_4_ * 0.0;
          auVar53._20_4_ = auVar122._20_4_ * 0.0;
          auVar53._24_4_ = auVar122._24_4_ * 0.0;
          auVar53._28_4_ = auVar119._28_4_;
          auVar161 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar159),auVar123);
          auVar54._4_4_ = auVar123._4_4_ * auVar99._4_4_;
          auVar54._0_4_ = auVar123._0_4_ * auVar99._0_4_;
          auVar54._8_4_ = auVar123._8_4_ * auVar99._8_4_;
          auVar54._12_4_ = auVar123._12_4_ * auVar99._12_4_;
          auVar54._16_4_ = auVar123._16_4_ * 0.0;
          auVar54._20_4_ = auVar123._20_4_ * 0.0;
          auVar54._24_4_ = auVar123._24_4_ * 0.0;
          auVar54._28_4_ = auVar123._28_4_;
          auVar26 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar101),auVar106);
          auVar55._4_4_ = auVar159._4_4_ * auVar106._4_4_;
          auVar55._0_4_ = auVar159._0_4_ * auVar106._0_4_;
          auVar55._8_4_ = auVar159._8_4_ * auVar106._8_4_;
          auVar55._12_4_ = auVar159._12_4_ * auVar106._12_4_;
          auVar55._16_4_ = auVar106._16_4_ * 0.0;
          auVar55._20_4_ = auVar106._20_4_ * 0.0;
          auVar55._24_4_ = auVar106._24_4_ * 0.0;
          auVar55._28_4_ = auVar106._28_4_;
          auVar102 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar99),auVar122);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar118,ZEXT1632(auVar26));
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar118,ZEXT1632(auVar161));
          auVar114 = ZEXT1632(auVar105);
          uVar84 = vcmpps_avx512vl(auVar122,auVar114,2);
          bVar83 = (byte)uVar84;
          fVar150 = (float)((uint)(bVar83 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar83 & 1) * auVar160._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          fVar152 = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar160._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          fVar155 = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar160._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          fVar156 = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar160._12_4_);
          auVar118 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar155,CONCAT44(fVar152,fVar150))));
          fVar151 = (float)((uint)(bVar83 & 1) * auVar97._0_4_ |
                           (uint)!(bool)(bVar83 & 1) * auVar100._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          fVar154 = (float)((uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * auVar100._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          fVar153 = (float)((uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * auVar100._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          fVar157 = (float)((uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * auVar100._12_4_);
          auVar109 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar153,CONCAT44(fVar154,fVar151))));
          auVar140._0_4_ =
               (float)((uint)(bVar83 & 1) * auVar120._0_4_ |
                      (uint)!(bool)(bVar83 & 1) * auVar176._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar12 * auVar120._4_4_ | (uint)!bVar12 * auVar176._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar12 * auVar120._8_4_ | (uint)!bVar12 * auVar176._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar12 * auVar120._12_4_ | (uint)!bVar12 * auVar176._12_4_);
          fVar179 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar120._16_4_);
          auVar140._16_4_ = fVar179;
          fVar174 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar120._20_4_);
          auVar140._20_4_ = fVar174;
          fVar173 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar120._24_4_);
          auVar140._24_4_ = fVar173;
          iVar1 = (uint)(byte)(uVar84 >> 7) * auVar120._28_4_;
          auVar140._28_4_ = iVar1;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar99),auVar108);
          auVar141._0_4_ =
               (uint)(bVar83 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar161._0_4_;
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * auVar161._4_4_;
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * auVar161._8_4_;
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * auVar161._12_4_;
          auVar141._16_4_ = (uint)((byte)(uVar84 >> 4) & 1) * auVar122._16_4_;
          auVar141._20_4_ = (uint)((byte)(uVar84 >> 5) & 1) * auVar122._20_4_;
          auVar141._24_4_ = (uint)((byte)(uVar84 >> 6) & 1) * auVar122._24_4_;
          auVar141._28_4_ = (uint)(byte)(uVar84 >> 7) * auVar122._28_4_;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar159),ZEXT1632(auVar96));
          auVar142._0_4_ =
               (float)((uint)(bVar83 & 1) * auVar122._0_4_ |
                      (uint)!(bool)(bVar83 & 1) * auVar103._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * auVar103._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * auVar103._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * auVar103._12_4_);
          fVar175 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar122._16_4_);
          auVar142._16_4_ = fVar175;
          fVar186 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar122._20_4_);
          auVar142._20_4_ = fVar186;
          fVar202 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar122._24_4_);
          auVar142._24_4_ = fVar202;
          auVar142._28_4_ = (uint)(byte)(uVar84 >> 7) * auVar122._28_4_;
          auVar122 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar104));
          auVar143._0_4_ =
               (float)((uint)(bVar83 & 1) * auVar122._0_4_ |
                      (uint)!(bool)(bVar83 & 1) * auVar97._0_4_);
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * auVar97._4_4_);
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * auVar97._8_4_);
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar143._12_4_ = (float)((uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * auVar97._12_4_)
          ;
          fVar94 = (float)((uint)((byte)(uVar84 >> 4) & 1) * auVar122._16_4_);
          auVar143._16_4_ = fVar94;
          fVar95 = (float)((uint)((byte)(uVar84 >> 5) & 1) * auVar122._20_4_);
          auVar143._20_4_ = fVar95;
          fVar149 = (float)((uint)((byte)(uVar84 >> 6) & 1) * auVar122._24_4_);
          auVar143._24_4_ = fVar149;
          iVar2 = (uint)(byte)(uVar84 >> 7) * auVar122._28_4_;
          auVar143._28_4_ = iVar2;
          auVar144._0_4_ =
               (uint)(bVar83 & 1) * (int)auVar99._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar108._0_4_;
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar12 * (int)auVar99._4_4_ | (uint)!bVar12 * auVar108._4_4_;
          bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar12 * (int)auVar99._8_4_ | (uint)!bVar12 * auVar108._8_4_;
          bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar12 * (int)auVar99._12_4_ | (uint)!bVar12 * auVar108._12_4_;
          auVar144._16_4_ = (uint)!(bool)((byte)(uVar84 >> 4) & 1) * auVar108._16_4_;
          auVar144._20_4_ = (uint)!(bool)((byte)(uVar84 >> 5) & 1) * auVar108._20_4_;
          auVar144._24_4_ = (uint)!(bool)((byte)(uVar84 >> 6) & 1) * auVar108._24_4_;
          auVar144._28_4_ = (uint)!SUB81(uVar84 >> 7,0) * auVar108._28_4_;
          bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar84 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar84 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar84 >> 3) & 1);
          auVar108 = vsubps_avx512vl(auVar144,auVar118);
          auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar159._12_4_ |
                                                   (uint)!bVar16 * auVar96._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar159._8_4_ |
                                                            (uint)!bVar14 * auVar96._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar159._4_4_ |
                                                                     (uint)!bVar12 * auVar96._4_4_,
                                                                     (uint)(bVar83 & 1) *
                                                                     (int)auVar159._0_4_ |
                                                                     (uint)!(bool)(bVar83 & 1) *
                                                                     auVar96._0_4_)))),auVar109);
          auVar215 = ZEXT3264(auVar123);
          auVar120 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar101._12_4_ |
                                                   (uint)!bVar17 * auVar104._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar101._8_4_ |
                                                            (uint)!bVar15 * auVar104._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar101._4_4_ |
                                                                     (uint)!bVar13 * auVar104._4_4_,
                                                                     (uint)(bVar83 & 1) *
                                                                     (int)auVar101._0_4_ |
                                                                     (uint)!(bool)(bVar83 & 1) *
                                                                     auVar104._0_4_)))),auVar140);
          auVar119 = vsubps_avx(auVar118,auVar141);
          auVar221 = ZEXT3264(auVar119);
          auVar106 = vsubps_avx(auVar109,auVar142);
          auVar107 = vsubps_avx(auVar140,auVar143);
          auVar56._4_4_ = auVar120._4_4_ * fVar152;
          auVar56._0_4_ = auVar120._0_4_ * fVar150;
          auVar56._8_4_ = auVar120._8_4_ * fVar155;
          auVar56._12_4_ = auVar120._12_4_ * fVar156;
          auVar56._16_4_ = auVar120._16_4_ * 0.0;
          auVar56._20_4_ = auVar120._20_4_ * 0.0;
          auVar56._24_4_ = auVar120._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar56,auVar140,auVar108);
          auVar200._0_4_ = fVar151 * auVar108._0_4_;
          auVar200._4_4_ = fVar154 * auVar108._4_4_;
          auVar200._8_4_ = fVar153 * auVar108._8_4_;
          auVar200._12_4_ = fVar157 * auVar108._12_4_;
          auVar200._16_4_ = auVar108._16_4_ * 0.0;
          auVar200._20_4_ = auVar108._20_4_ * 0.0;
          auVar200._24_4_ = auVar108._24_4_ * 0.0;
          auVar200._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar200,auVar118,auVar123);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar114,ZEXT1632(auVar96));
          auVar207._0_4_ = auVar123._0_4_ * auVar140._0_4_;
          auVar207._4_4_ = auVar123._4_4_ * auVar140._4_4_;
          auVar207._8_4_ = auVar123._8_4_ * auVar140._8_4_;
          auVar207._12_4_ = auVar123._12_4_ * auVar140._12_4_;
          auVar207._16_4_ = auVar123._16_4_ * fVar179;
          auVar207._20_4_ = auVar123._20_4_ * fVar174;
          auVar207._24_4_ = auVar123._24_4_ * fVar173;
          auVar207._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar207,auVar109,auVar120);
          auVar110 = vfmadd231ps_avx512vl(auVar122,auVar114,ZEXT1632(auVar96));
          auVar122 = vmulps_avx512vl(auVar107,auVar141);
          auVar122 = vfmsub231ps_avx512vl(auVar122,auVar119,auVar143);
          auVar57._4_4_ = auVar106._4_4_ * auVar143._4_4_;
          auVar57._0_4_ = auVar106._0_4_ * auVar143._0_4_;
          auVar57._8_4_ = auVar106._8_4_ * auVar143._8_4_;
          auVar57._12_4_ = auVar106._12_4_ * auVar143._12_4_;
          auVar57._16_4_ = auVar106._16_4_ * fVar94;
          auVar57._20_4_ = auVar106._20_4_ * fVar95;
          auVar57._24_4_ = auVar106._24_4_ * fVar149;
          auVar57._28_4_ = iVar2;
          auVar96 = vfmsub231ps_fma(auVar57,auVar142,auVar107);
          auVar208._0_4_ = auVar142._0_4_ * auVar119._0_4_;
          auVar208._4_4_ = auVar142._4_4_ * auVar119._4_4_;
          auVar208._8_4_ = auVar142._8_4_ * auVar119._8_4_;
          auVar208._12_4_ = auVar142._12_4_ * auVar119._12_4_;
          auVar208._16_4_ = fVar175 * auVar119._16_4_;
          auVar208._20_4_ = fVar186 * auVar119._20_4_;
          auVar208._24_4_ = fVar202 * auVar119._24_4_;
          auVar208._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar208,auVar106,auVar141);
          auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar114,auVar122);
          auVar113 = vfmadd231ps_avx512vl(auVar122,auVar114,ZEXT1632(auVar96));
          auVar209 = ZEXT3264(auVar113);
          auVar122 = vmaxps_avx(auVar110,auVar113);
          uVar32 = vcmpps_avx512vl(auVar122,auVar114,2);
          bVar93 = bVar93 & (byte)uVar32;
          if (bVar93 != 0) {
            uVar158 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar236._4_4_ = uVar158;
            auVar236._0_4_ = uVar158;
            auVar236._8_4_ = uVar158;
            auVar236._12_4_ = uVar158;
            auVar236._16_4_ = uVar158;
            auVar236._20_4_ = uVar158;
            auVar236._24_4_ = uVar158;
            auVar236._28_4_ = uVar158;
            auVar237 = ZEXT3264(auVar236);
            auVar58._4_4_ = auVar107._4_4_ * auVar123._4_4_;
            auVar58._0_4_ = auVar107._0_4_ * auVar123._0_4_;
            auVar58._8_4_ = auVar107._8_4_ * auVar123._8_4_;
            auVar58._12_4_ = auVar107._12_4_ * auVar123._12_4_;
            auVar58._16_4_ = auVar107._16_4_ * auVar123._16_4_;
            auVar58._20_4_ = auVar107._20_4_ * auVar123._20_4_;
            auVar58._24_4_ = auVar107._24_4_ * auVar123._24_4_;
            auVar58._28_4_ = auVar122._28_4_;
            auVar26 = vfmsub231ps_fma(auVar58,auVar106,auVar120);
            auVar59._4_4_ = auVar120._4_4_ * auVar119._4_4_;
            auVar59._0_4_ = auVar120._0_4_ * auVar119._0_4_;
            auVar59._8_4_ = auVar120._8_4_ * auVar119._8_4_;
            auVar59._12_4_ = auVar120._12_4_ * auVar119._12_4_;
            auVar59._16_4_ = auVar120._16_4_ * auVar119._16_4_;
            auVar59._20_4_ = auVar120._20_4_ * auVar119._20_4_;
            auVar59._24_4_ = auVar120._24_4_ * auVar119._24_4_;
            auVar59._28_4_ = auVar120._28_4_;
            auVar161 = vfmsub231ps_fma(auVar59,auVar108,auVar107);
            auVar60._4_4_ = auVar106._4_4_ * auVar108._4_4_;
            auVar60._0_4_ = auVar106._0_4_ * auVar108._0_4_;
            auVar60._8_4_ = auVar106._8_4_ * auVar108._8_4_;
            auVar60._12_4_ = auVar106._12_4_ * auVar108._12_4_;
            auVar60._16_4_ = auVar106._16_4_ * auVar108._16_4_;
            auVar60._20_4_ = auVar106._20_4_ * auVar108._20_4_;
            auVar60._24_4_ = auVar106._24_4_ * auVar108._24_4_;
            auVar60._28_4_ = auVar106._28_4_;
            auVar103 = vfmsub231ps_fma(auVar60,auVar119,auVar123);
            auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar161),ZEXT1632(auVar103));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar26),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar122 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
            auVar221 = ZEXT3264(auVar122);
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar38._16_4_ = 0x3f800000;
            auVar38._20_4_ = 0x3f800000;
            auVar38._24_4_ = 0x3f800000;
            auVar38._28_4_ = 0x3f800000;
            auVar123 = vfnmadd213ps_avx512vl(auVar122,ZEXT1632(auVar104),auVar38);
            auVar96 = vfmadd132ps_fma(auVar123,auVar122,auVar122);
            auVar215 = ZEXT1664(auVar96);
            auVar61._4_4_ = auVar103._4_4_ * auVar140._4_4_;
            auVar61._0_4_ = auVar103._0_4_ * auVar140._0_4_;
            auVar61._8_4_ = auVar103._8_4_ * auVar140._8_4_;
            auVar61._12_4_ = auVar103._12_4_ * auVar140._12_4_;
            auVar61._16_4_ = fVar179 * 0.0;
            auVar61._20_4_ = fVar174 * 0.0;
            auVar61._24_4_ = fVar173 * 0.0;
            auVar61._28_4_ = iVar1;
            auVar161 = vfmadd231ps_fma(auVar61,auVar109,ZEXT1632(auVar161));
            auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar118,ZEXT1632(auVar26));
            fVar179 = auVar96._0_4_;
            fVar173 = auVar96._4_4_;
            fVar174 = auVar96._8_4_;
            fVar175 = auVar96._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar161._12_4_ * fVar175,
                                           CONCAT48(auVar161._8_4_ * fVar174,
                                                    CONCAT44(auVar161._4_4_ * fVar173,
                                                             auVar161._0_4_ * fVar179))));
            auVar238 = ZEXT3264(local_5a0);
            uVar32 = vcmpps_avx512vl(local_5a0,auVar236,2);
            auVar82._4_4_ = uStack_75c;
            auVar82._0_4_ = local_760;
            auVar82._8_4_ = uStack_758;
            auVar82._12_4_ = uStack_754;
            auVar82._16_4_ = uStack_750;
            auVar82._20_4_ = uStack_74c;
            auVar82._24_4_ = uStack_748;
            auVar82._28_4_ = uStack_744;
            uVar33 = vcmpps_avx512vl(local_5a0,auVar82,0xd);
            bVar93 = (byte)uVar32 & (byte)uVar33 & bVar93;
            if (bVar93 != 0) {
              uVar88 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar88 = bVar93 & uVar88;
              if ((char)uVar88 != '\0') {
                fVar186 = auVar110._0_4_ * fVar179;
                fVar202 = auVar110._4_4_ * fVar173;
                auVar62._4_4_ = fVar202;
                auVar62._0_4_ = fVar186;
                fVar94 = auVar110._8_4_ * fVar174;
                auVar62._8_4_ = fVar94;
                fVar95 = auVar110._12_4_ * fVar175;
                auVar62._12_4_ = fVar95;
                fVar149 = auVar110._16_4_ * 0.0;
                auVar62._16_4_ = fVar149;
                fVar150 = auVar110._20_4_ * 0.0;
                auVar62._20_4_ = fVar150;
                fVar151 = auVar110._24_4_ * 0.0;
                auVar62._24_4_ = fVar151;
                auVar62._28_4_ = auVar110._28_4_;
                auVar185._8_4_ = 0x3f800000;
                auVar185._0_8_ = 0x3f8000003f800000;
                auVar185._12_4_ = 0x3f800000;
                auVar185._16_4_ = 0x3f800000;
                auVar185._20_4_ = 0x3f800000;
                auVar185._24_4_ = 0x3f800000;
                auVar185._28_4_ = 0x3f800000;
                auVar122 = vsubps_avx(auVar185,auVar62);
                local_5e0._0_4_ =
                     (float)((uint)(bVar83 & 1) * (int)fVar186 |
                            (uint)!(bool)(bVar83 & 1) * auVar122._0_4_);
                bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar202 | (uint)!bVar12 * auVar122._4_4_);
                bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar94 | (uint)!bVar12 * auVar122._8_4_);
                bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar95 | (uint)!bVar12 * auVar122._12_4_);
                bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar149 | (uint)!bVar12 * auVar122._16_4_);
                bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar150 | (uint)!bVar12 * auVar122._20_4_);
                bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar151 | (uint)!bVar12 * auVar122._24_4_);
                bVar12 = SUB81(uVar84 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar122._28_4_);
                auVar122 = vsubps_avx(auVar112,auVar111);
                auVar96 = vfmadd213ps_fma(auVar122,local_5e0,auVar111);
                uVar158 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar39._4_4_ = uVar158;
                auVar39._0_4_ = uVar158;
                auVar39._8_4_ = uVar158;
                auVar39._12_4_ = uVar158;
                auVar39._16_4_ = uVar158;
                auVar39._20_4_ = uVar158;
                auVar39._24_4_ = uVar158;
                auVar39._28_4_ = uVar158;
                auVar122 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                              CONCAT48(auVar96._8_4_ + auVar96._8_4_
                                                                       ,CONCAT44(auVar96._4_4_ +
                                                                                 auVar96._4_4_,
                                                                                 auVar96._0_4_ +
                                                                                 auVar96._0_4_)))),
                                           auVar39);
                uVar34 = vcmpps_avx512vl(local_5a0,auVar122,6);
                uVar88 = uVar88 & uVar34;
                bVar93 = (byte)uVar88;
                if (bVar93 != 0) {
                  auVar178._0_4_ = auVar113._0_4_ * fVar179;
                  auVar178._4_4_ = auVar113._4_4_ * fVar173;
                  auVar178._8_4_ = auVar113._8_4_ * fVar174;
                  auVar178._12_4_ = auVar113._12_4_ * fVar175;
                  auVar178._16_4_ = auVar113._16_4_ * 0.0;
                  auVar178._20_4_ = auVar113._20_4_ * 0.0;
                  auVar178._24_4_ = auVar113._24_4_ * 0.0;
                  auVar178._28_4_ = 0;
                  auVar201._8_4_ = 0x3f800000;
                  auVar201._0_8_ = 0x3f8000003f800000;
                  auVar201._12_4_ = 0x3f800000;
                  auVar201._16_4_ = 0x3f800000;
                  auVar201._20_4_ = 0x3f800000;
                  auVar201._24_4_ = 0x3f800000;
                  auVar201._28_4_ = 0x3f800000;
                  auVar122 = vsubps_avx(auVar201,auVar178);
                  auVar145._0_4_ =
                       (uint)(bVar83 & 1) * (int)auVar178._0_4_ |
                       (uint)!(bool)(bVar83 & 1) * auVar122._0_4_;
                  bVar12 = (bool)((byte)(uVar84 >> 1) & 1);
                  auVar145._4_4_ =
                       (uint)bVar12 * (int)auVar178._4_4_ | (uint)!bVar12 * auVar122._4_4_;
                  bVar12 = (bool)((byte)(uVar84 >> 2) & 1);
                  auVar145._8_4_ =
                       (uint)bVar12 * (int)auVar178._8_4_ | (uint)!bVar12 * auVar122._8_4_;
                  bVar12 = (bool)((byte)(uVar84 >> 3) & 1);
                  auVar145._12_4_ =
                       (uint)bVar12 * (int)auVar178._12_4_ | (uint)!bVar12 * auVar122._12_4_;
                  bVar12 = (bool)((byte)(uVar84 >> 4) & 1);
                  auVar145._16_4_ =
                       (uint)bVar12 * (int)auVar178._16_4_ | (uint)!bVar12 * auVar122._16_4_;
                  bVar12 = (bool)((byte)(uVar84 >> 5) & 1);
                  auVar145._20_4_ =
                       (uint)bVar12 * (int)auVar178._20_4_ | (uint)!bVar12 * auVar122._20_4_;
                  bVar12 = (bool)((byte)(uVar84 >> 6) & 1);
                  auVar145._24_4_ =
                       (uint)bVar12 * (int)auVar178._24_4_ | (uint)!bVar12 * auVar122._24_4_;
                  auVar145._28_4_ = (uint)!SUB81(uVar84 >> 7,0) * auVar122._28_4_;
                  auVar40._8_4_ = 0x40000000;
                  auVar40._0_8_ = 0x4000000040000000;
                  auVar40._12_4_ = 0x40000000;
                  auVar40._16_4_ = 0x40000000;
                  auVar40._20_4_ = 0x40000000;
                  auVar40._24_4_ = 0x40000000;
                  auVar40._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar145,auVar201,auVar40);
                  local_580 = (undefined4)lVar90;
                  pGVar91 = (context->scene->geometries).items[uVar89].ptr;
                  if ((pGVar91->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar96 = vcvtsi2ss_avx512f(auVar105,local_580);
                    fVar179 = auVar96._0_4_;
                    local_520[0] = (fVar179 + local_5e0._0_4_ + 0.0) * (float)local_7e0;
                    local_520[1] = (fVar179 + local_5e0._4_4_ + 1.0) * local_7e0._4_4_;
                    local_520[2] = (fVar179 + local_5e0._8_4_ + 2.0) * fStack_7d8;
                    local_520[3] = (fVar179 + local_5e0._12_4_ + 3.0) * fStack_7d4;
                    fStack_510 = (fVar179 + local_5e0._16_4_ + 4.0) * fStack_7d0;
                    fStack_50c = (fVar179 + local_5e0._20_4_ + 5.0) * fStack_7cc;
                    fStack_508 = (fVar179 + local_5e0._24_4_ + 6.0) * fStack_7c8;
                    fStack_504 = fVar179 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar167._8_4_ = 0x7f800000;
                    auVar167._0_8_ = 0x7f8000007f800000;
                    auVar167._12_4_ = 0x7f800000;
                    auVar167._16_4_ = 0x7f800000;
                    auVar167._20_4_ = 0x7f800000;
                    auVar167._24_4_ = 0x7f800000;
                    auVar167._28_4_ = 0x7f800000;
                    auVar122 = vblendmps_avx512vl(auVar167,local_5a0);
                    auVar146._0_4_ =
                         (uint)(bVar93 & 1) * auVar122._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
                    auVar146._4_4_ = (uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                    auVar146._8_4_ = (uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
                    auVar146._12_4_ = (uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
                    auVar146._16_4_ = (uint)bVar12 * auVar122._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
                    auVar146._20_4_ = (uint)bVar12 * auVar122._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
                    auVar146._24_4_ = (uint)bVar12 * auVar122._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar88 >> 7,0);
                    auVar146._28_4_ = (uint)bVar12 * auVar122._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar122 = vshufps_avx(auVar146,auVar146,0xb1);
                    auVar122 = vminps_avx(auVar146,auVar122);
                    auVar123 = vshufpd_avx(auVar122,auVar122,5);
                    auVar122 = vminps_avx(auVar122,auVar123);
                    auVar123 = vpermpd_avx2(auVar122,0x4e);
                    auVar122 = vminps_avx(auVar122,auVar123);
                    uVar32 = vcmpps_avx512vl(auVar146,auVar122,0);
                    uVar85 = (uint)uVar88;
                    if (((byte)uVar32 & bVar93) != 0) {
                      uVar85 = (uint)((byte)uVar32 & bVar93);
                    }
                    uVar86 = 0;
                    for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                      uVar86 = uVar86 + 1;
                    }
                    uVar84 = (ulong)uVar86;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3a0 = vmovdqa64_avx512vl(auVar227._0_32_);
                      local_800._0_4_ = iVar87;
                      local_480._0_32_ = local_5a0;
                      local_848 = uVar92;
                      local_57c = iVar87;
                      local_570 = auVar98;
                      local_560 = uVar31;
                      uStack_558 = uVar76;
                      local_550 = uVar77;
                      uStack_548 = uVar78;
                      local_540 = uVar79;
                      uStack_538 = uVar80;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar84]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar84 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar84 * 4);
                        local_880.context = context->user;
                        fVar173 = local_200._0_4_;
                        fVar179 = 1.0 - fVar173;
                        auVar26 = vfnmadd231ss_fma(ZEXT416((uint)(fVar173 * (fVar179 + fVar179))),
                                                   ZEXT416((uint)fVar179),ZEXT416((uint)fVar179));
                        auVar161 = local_200._0_16_;
                        auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                                  ZEXT416(0xc0a00000));
                        auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * 3.0)),
                                                   ZEXT416((uint)(fVar173 + fVar173)),auVar96);
                        auVar221 = ZEXT1664(auVar104);
                        auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                                  ZEXT416(0x40000000));
                        auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179 * -3.0)),
                                                  ZEXT416((uint)(fVar179 + fVar179)),auVar96);
                        auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173)),auVar161,
                                                   ZEXT416((uint)(fVar179 * -2.0)));
                        fVar179 = auVar26._0_4_ * 0.5;
                        fVar173 = auVar104._0_4_ * 0.5;
                        fVar174 = auVar96._0_4_ * 0.5;
                        fVar175 = auVar161._0_4_ * 0.5;
                        auVar195._0_4_ = fVar175 * local_8c0;
                        auVar195._4_4_ = fVar175 * fStack_8bc;
                        auVar195._8_4_ = fVar175 * fStack_8b8;
                        auVar195._12_4_ = fVar175 * fStack_8b4;
                        auVar213._4_4_ = fVar174;
                        auVar213._0_4_ = fVar174;
                        auVar213._8_4_ = fVar174;
                        auVar213._12_4_ = fVar174;
                        auVar96 = vfmadd132ps_fma(auVar213,auVar195,auVar29);
                        auVar196._4_4_ = fVar173;
                        auVar196._0_4_ = fVar173;
                        auVar196._8_4_ = fVar173;
                        auVar196._12_4_ = fVar173;
                        auVar96 = vfmadd132ps_fma(auVar196,auVar96,auVar30);
                        auVar162._4_4_ = fVar179;
                        auVar162._0_4_ = fVar179;
                        auVar162._8_4_ = fVar179;
                        auVar162._12_4_ = fVar179;
                        auVar96 = vfmadd213ps_fma(auVar162,auVar98,auVar96);
                        auVar172 = vbroadcastss_avx512f(auVar96);
                        auVar209 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar209 = vpermps_avx512f(auVar209,ZEXT1664(auVar96));
                        auVar215 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar215,ZEXT1664(auVar96));
                        local_2c0[0] = (RTCHitN)auVar172[0];
                        local_2c0[1] = (RTCHitN)auVar172[1];
                        local_2c0[2] = (RTCHitN)auVar172[2];
                        local_2c0[3] = (RTCHitN)auVar172[3];
                        local_2c0[4] = (RTCHitN)auVar172[4];
                        local_2c0[5] = (RTCHitN)auVar172[5];
                        local_2c0[6] = (RTCHitN)auVar172[6];
                        local_2c0[7] = (RTCHitN)auVar172[7];
                        local_2c0[8] = (RTCHitN)auVar172[8];
                        local_2c0[9] = (RTCHitN)auVar172[9];
                        local_2c0[10] = (RTCHitN)auVar172[10];
                        local_2c0[0xb] = (RTCHitN)auVar172[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar172[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar172[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar172[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar172[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar172[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar172[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar172[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar172[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar172[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar172[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar172[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar172[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar172[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar172[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar172[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar172[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar172[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar172[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar172[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar172[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar172[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar172[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar172[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar172[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar172[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar172[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar172[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar172[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar172[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar172[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar172[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar172[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar172[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar172[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar172[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar172[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar172[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar172[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar172[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar172[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar172[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar172[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar172[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar172[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar172[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar172[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar172[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar172[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar172[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar172[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar172[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar172[0x3f];
                        local_280 = auVar209;
                        local_180 = local_400._0_8_;
                        uStack_178 = local_400._8_8_;
                        uStack_170 = local_400._16_8_;
                        uStack_168 = local_400._24_8_;
                        uStack_160 = local_400._32_8_;
                        uStack_158 = local_400._40_8_;
                        uStack_150 = local_400._48_8_;
                        uStack_148 = local_400._56_8_;
                        auVar172 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar172);
                        auVar122 = vpcmpeqd_avx2(auVar172._0_32_,auVar172._0_32_);
                        local_850[3] = auVar122;
                        local_850[2] = auVar122;
                        local_850[1] = auVar122;
                        *local_850 = auVar122;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_880.context)->instPrimID[0]))
                        ;
                        auVar172 = vmovdqa64_avx512f(local_300);
                        local_740 = vmovdqa64_avx512f(auVar172);
                        local_880.valid = (int *)local_740;
                        local_880.geometryUserPtr = pGVar91->userPtr;
                        local_880.hit = local_2c0;
                        local_880.N = 0x10;
                        local_820 = auVar237._0_32_;
                        local_880.ray = (RTCRayN *)ray;
                        if (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar209 = ZEXT1664(auVar209._0_16_);
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          auVar221 = ZEXT1664(auVar104);
                          (*pGVar91->intersectionFilterN)(&local_880);
                          auVar238 = ZEXT3264(local_480._0_32_);
                          auVar237 = ZEXT3264(local_820);
                          auVar172 = vmovdqa64_avx512f(local_740);
                        }
                        uVar32 = vptestmd_avx512f(auVar172,auVar172);
                        if ((short)uVar32 == 0) {
LAB_01ada13f:
                          *(int *)(ray + k * 4 + 0x200) = auVar237._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar91->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar209 = ZEXT1664(auVar209._0_16_);
                            auVar215 = ZEXT1664(auVar215._0_16_);
                            auVar221 = ZEXT1664(auVar221._0_16_);
                            (*p_Var11)(&local_880);
                            auVar238 = ZEXT3264(local_480._0_32_);
                            auVar237 = ZEXT3264(local_820);
                            auVar172 = vmovdqa64_avx512f(local_740);
                          }
                          uVar92 = vptestmd_avx512f(auVar172,auVar172);
                          if ((short)uVar92 == 0) goto LAB_01ada13f;
                          iVar87 = *(int *)(local_880.hit + 4);
                          iVar1 = *(int *)(local_880.hit + 8);
                          iVar2 = *(int *)(local_880.hit + 0xc);
                          iVar63 = *(int *)(local_880.hit + 0x10);
                          iVar64 = *(int *)(local_880.hit + 0x14);
                          iVar65 = *(int *)(local_880.hit + 0x18);
                          iVar66 = *(int *)(local_880.hit + 0x1c);
                          iVar67 = *(int *)(local_880.hit + 0x20);
                          iVar68 = *(int *)(local_880.hit + 0x24);
                          iVar69 = *(int *)(local_880.hit + 0x28);
                          iVar70 = *(int *)(local_880.hit + 0x2c);
                          iVar71 = *(int *)(local_880.hit + 0x30);
                          iVar72 = *(int *)(local_880.hit + 0x34);
                          iVar73 = *(int *)(local_880.hit + 0x38);
                          iVar74 = *(int *)(local_880.hit + 0x3c);
                          bVar93 = (byte)uVar92;
                          bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar92 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar92 >> 7) & 1);
                          bVar83 = (byte)(uVar92 >> 8);
                          bVar19 = (bool)((byte)(uVar92 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar92 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar92 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar92 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar92 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar92 >> 0xe) & 1);
                          bVar25 = SUB81(uVar92 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x300) =
                               (uint)(bVar93 & 1) * *(int *)local_880.hit |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x300);
                          *(uint *)(local_880.ray + 0x304) =
                               (uint)bVar12 * iVar87 |
                               (uint)!bVar12 * *(int *)(local_880.ray + 0x304);
                          *(uint *)(local_880.ray + 0x308) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_880.ray + 0x308);
                          *(uint *)(local_880.ray + 0x30c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_880.ray + 0x30c);
                          *(uint *)(local_880.ray + 0x310) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_880.ray + 0x310);
                          *(uint *)(local_880.ray + 0x314) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_880.ray + 0x314);
                          *(uint *)(local_880.ray + 0x318) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_880.ray + 0x318);
                          *(uint *)(local_880.ray + 0x31c) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_880.ray + 0x31c);
                          *(uint *)(local_880.ray + 800) =
                               (uint)(bVar83 & 1) * iVar67 |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 800);
                          *(uint *)(local_880.ray + 0x324) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_880.ray + 0x324);
                          *(uint *)(local_880.ray + 0x328) =
                               (uint)bVar20 * iVar69 |
                               (uint)!bVar20 * *(int *)(local_880.ray + 0x328);
                          *(uint *)(local_880.ray + 0x32c) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x32c);
                          *(uint *)(local_880.ray + 0x330) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x330);
                          *(uint *)(local_880.ray + 0x334) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x334);
                          *(uint *)(local_880.ray + 0x338) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x338);
                          *(uint *)(local_880.ray + 0x33c) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x33c);
                          iVar87 = *(int *)(local_880.hit + 0x44);
                          iVar1 = *(int *)(local_880.hit + 0x48);
                          iVar2 = *(int *)(local_880.hit + 0x4c);
                          iVar63 = *(int *)(local_880.hit + 0x50);
                          iVar64 = *(int *)(local_880.hit + 0x54);
                          iVar65 = *(int *)(local_880.hit + 0x58);
                          iVar66 = *(int *)(local_880.hit + 0x5c);
                          iVar67 = *(int *)(local_880.hit + 0x60);
                          iVar68 = *(int *)(local_880.hit + 100);
                          iVar69 = *(int *)(local_880.hit + 0x68);
                          iVar70 = *(int *)(local_880.hit + 0x6c);
                          iVar71 = *(int *)(local_880.hit + 0x70);
                          iVar72 = *(int *)(local_880.hit + 0x74);
                          iVar73 = *(int *)(local_880.hit + 0x78);
                          iVar74 = *(int *)(local_880.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar92 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar92 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar92 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar92 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar92 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar92 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar92 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar92 >> 0xe) & 1);
                          bVar25 = SUB81(uVar92 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x340) =
                               (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0x40) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x340);
                          *(uint *)(local_880.ray + 0x344) =
                               (uint)bVar12 * iVar87 |
                               (uint)!bVar12 * *(int *)(local_880.ray + 0x344);
                          *(uint *)(local_880.ray + 0x348) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_880.ray + 0x348);
                          *(uint *)(local_880.ray + 0x34c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_880.ray + 0x34c);
                          *(uint *)(local_880.ray + 0x350) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_880.ray + 0x350);
                          *(uint *)(local_880.ray + 0x354) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_880.ray + 0x354);
                          *(uint *)(local_880.ray + 0x358) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_880.ray + 0x358);
                          *(uint *)(local_880.ray + 0x35c) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_880.ray + 0x35c);
                          *(uint *)(local_880.ray + 0x360) =
                               (uint)(bVar83 & 1) * iVar67 |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x360);
                          *(uint *)(local_880.ray + 0x364) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_880.ray + 0x364);
                          *(uint *)(local_880.ray + 0x368) =
                               (uint)bVar20 * iVar69 |
                               (uint)!bVar20 * *(int *)(local_880.ray + 0x368);
                          *(uint *)(local_880.ray + 0x36c) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x36c);
                          *(uint *)(local_880.ray + 0x370) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x370);
                          *(uint *)(local_880.ray + 0x374) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x374);
                          *(uint *)(local_880.ray + 0x378) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x378);
                          *(uint *)(local_880.ray + 0x37c) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x37c);
                          iVar87 = *(int *)(local_880.hit + 0x84);
                          iVar1 = *(int *)(local_880.hit + 0x88);
                          iVar2 = *(int *)(local_880.hit + 0x8c);
                          iVar63 = *(int *)(local_880.hit + 0x90);
                          iVar64 = *(int *)(local_880.hit + 0x94);
                          iVar65 = *(int *)(local_880.hit + 0x98);
                          iVar66 = *(int *)(local_880.hit + 0x9c);
                          iVar67 = *(int *)(local_880.hit + 0xa0);
                          iVar68 = *(int *)(local_880.hit + 0xa4);
                          iVar69 = *(int *)(local_880.hit + 0xa8);
                          iVar70 = *(int *)(local_880.hit + 0xac);
                          iVar71 = *(int *)(local_880.hit + 0xb0);
                          iVar72 = *(int *)(local_880.hit + 0xb4);
                          iVar73 = *(int *)(local_880.hit + 0xb8);
                          iVar74 = *(int *)(local_880.hit + 0xbc);
                          bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar92 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar92 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar92 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar92 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar92 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar92 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar92 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar92 >> 0xe) & 1);
                          bVar25 = SUB81(uVar92 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x380) =
                               (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0x80) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x380);
                          *(uint *)(local_880.ray + 900) =
                               (uint)bVar12 * iVar87 | (uint)!bVar12 * *(int *)(local_880.ray + 900)
                          ;
                          *(uint *)(local_880.ray + 0x388) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_880.ray + 0x388);
                          *(uint *)(local_880.ray + 0x38c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_880.ray + 0x38c);
                          *(uint *)(local_880.ray + 0x390) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_880.ray + 0x390);
                          *(uint *)(local_880.ray + 0x394) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_880.ray + 0x394);
                          *(uint *)(local_880.ray + 0x398) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_880.ray + 0x398);
                          *(uint *)(local_880.ray + 0x39c) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_880.ray + 0x39c);
                          *(uint *)(local_880.ray + 0x3a0) =
                               (uint)(bVar83 & 1) * iVar67 |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x3a0);
                          *(uint *)(local_880.ray + 0x3a4) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_880.ray + 0x3a4);
                          *(uint *)(local_880.ray + 0x3a8) =
                               (uint)bVar20 * iVar69 |
                               (uint)!bVar20 * *(int *)(local_880.ray + 0x3a8);
                          *(uint *)(local_880.ray + 0x3ac) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x3ac);
                          *(uint *)(local_880.ray + 0x3b0) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x3b0);
                          *(uint *)(local_880.ray + 0x3b4) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x3b4);
                          *(uint *)(local_880.ray + 0x3b8) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x3b8);
                          *(uint *)(local_880.ray + 0x3bc) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x3bc);
                          iVar87 = *(int *)(local_880.hit + 0xc4);
                          iVar1 = *(int *)(local_880.hit + 200);
                          iVar2 = *(int *)(local_880.hit + 0xcc);
                          iVar63 = *(int *)(local_880.hit + 0xd0);
                          iVar64 = *(int *)(local_880.hit + 0xd4);
                          iVar65 = *(int *)(local_880.hit + 0xd8);
                          iVar66 = *(int *)(local_880.hit + 0xdc);
                          iVar67 = *(int *)(local_880.hit + 0xe0);
                          iVar68 = *(int *)(local_880.hit + 0xe4);
                          iVar69 = *(int *)(local_880.hit + 0xe8);
                          iVar70 = *(int *)(local_880.hit + 0xec);
                          iVar71 = *(int *)(local_880.hit + 0xf0);
                          iVar72 = *(int *)(local_880.hit + 0xf4);
                          iVar73 = *(int *)(local_880.hit + 0xf8);
                          iVar74 = *(int *)(local_880.hit + 0xfc);
                          bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar92 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar92 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar92 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar92 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar92 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar92 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar92 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar92 >> 0xe) & 1);
                          bVar25 = SUB81(uVar92 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x3c0) =
                               (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0xc0) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x3c0);
                          *(uint *)(local_880.ray + 0x3c4) =
                               (uint)bVar12 * iVar87 |
                               (uint)!bVar12 * *(int *)(local_880.ray + 0x3c4);
                          *(uint *)(local_880.ray + 0x3c8) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_880.ray + 0x3c8);
                          *(uint *)(local_880.ray + 0x3cc) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_880.ray + 0x3cc);
                          *(uint *)(local_880.ray + 0x3d0) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_880.ray + 0x3d0);
                          *(uint *)(local_880.ray + 0x3d4) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_880.ray + 0x3d4);
                          *(uint *)(local_880.ray + 0x3d8) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_880.ray + 0x3d8);
                          *(uint *)(local_880.ray + 0x3dc) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_880.ray + 0x3dc);
                          *(uint *)(local_880.ray + 0x3e0) =
                               (uint)(bVar83 & 1) * iVar67 |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x3e0);
                          *(uint *)(local_880.ray + 0x3e4) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_880.ray + 0x3e4);
                          *(uint *)(local_880.ray + 1000) =
                               (uint)bVar20 * iVar69 |
                               (uint)!bVar20 * *(int *)(local_880.ray + 1000);
                          *(uint *)(local_880.ray + 0x3ec) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x3ec);
                          *(uint *)(local_880.ray + 0x3f0) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x3f0);
                          *(uint *)(local_880.ray + 0x3f4) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x3f4);
                          *(uint *)(local_880.ray + 0x3f8) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x3f8);
                          *(uint *)(local_880.ray + 0x3fc) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x3fc);
                          iVar87 = *(int *)(local_880.hit + 0x104);
                          iVar1 = *(int *)(local_880.hit + 0x108);
                          iVar2 = *(int *)(local_880.hit + 0x10c);
                          iVar63 = *(int *)(local_880.hit + 0x110);
                          iVar64 = *(int *)(local_880.hit + 0x114);
                          iVar65 = *(int *)(local_880.hit + 0x118);
                          iVar66 = *(int *)(local_880.hit + 0x11c);
                          iVar67 = *(int *)(local_880.hit + 0x120);
                          iVar68 = *(int *)(local_880.hit + 0x124);
                          iVar69 = *(int *)(local_880.hit + 0x128);
                          iVar70 = *(int *)(local_880.hit + 300);
                          iVar71 = *(int *)(local_880.hit + 0x130);
                          iVar72 = *(int *)(local_880.hit + 0x134);
                          iVar73 = *(int *)(local_880.hit + 0x138);
                          iVar74 = *(int *)(local_880.hit + 0x13c);
                          bVar12 = (bool)((byte)(uVar92 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar92 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar92 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar92 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar92 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar92 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar92 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar92 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar92 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar92 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar92 >> 0xe) & 1);
                          bVar25 = SUB81(uVar92 >> 0xf,0);
                          *(uint *)(local_880.ray + 0x400) =
                               (uint)(bVar93 & 1) * *(int *)(local_880.hit + 0x100) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_880.ray + 0x400);
                          *(uint *)(local_880.ray + 0x404) =
                               (uint)bVar12 * iVar87 |
                               (uint)!bVar12 * *(int *)(local_880.ray + 0x404);
                          *(uint *)(local_880.ray + 0x408) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_880.ray + 0x408);
                          *(uint *)(local_880.ray + 0x40c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_880.ray + 0x40c);
                          *(uint *)(local_880.ray + 0x410) =
                               (uint)bVar15 * iVar63 |
                               (uint)!bVar15 * *(int *)(local_880.ray + 0x410);
                          *(uint *)(local_880.ray + 0x414) =
                               (uint)bVar16 * iVar64 |
                               (uint)!bVar16 * *(int *)(local_880.ray + 0x414);
                          *(uint *)(local_880.ray + 0x418) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_880.ray + 0x418);
                          *(uint *)(local_880.ray + 0x41c) =
                               (uint)bVar18 * iVar66 |
                               (uint)!bVar18 * *(int *)(local_880.ray + 0x41c);
                          *(uint *)(local_880.ray + 0x420) =
                               (uint)(bVar83 & 1) * iVar67 |
                               (uint)!(bool)(bVar83 & 1) * *(int *)(local_880.ray + 0x420);
                          *(uint *)(local_880.ray + 0x424) =
                               (uint)bVar19 * iVar68 |
                               (uint)!bVar19 * *(int *)(local_880.ray + 0x424);
                          *(uint *)(local_880.ray + 0x428) =
                               (uint)bVar20 * iVar69 |
                               (uint)!bVar20 * *(int *)(local_880.ray + 0x428);
                          *(uint *)(local_880.ray + 0x42c) =
                               (uint)bVar21 * iVar70 |
                               (uint)!bVar21 * *(int *)(local_880.ray + 0x42c);
                          *(uint *)(local_880.ray + 0x430) =
                               (uint)bVar22 * iVar71 |
                               (uint)!bVar22 * *(int *)(local_880.ray + 0x430);
                          *(uint *)(local_880.ray + 0x434) =
                               (uint)bVar23 * iVar72 |
                               (uint)!bVar23 * *(int *)(local_880.ray + 0x434);
                          *(uint *)(local_880.ray + 0x438) =
                               (uint)bVar24 * iVar73 |
                               (uint)!bVar24 * *(int *)(local_880.ray + 0x438);
                          *(uint *)(local_880.ray + 0x43c) =
                               (uint)bVar25 * iVar74 |
                               (uint)!bVar25 * *(int *)(local_880.ray + 0x43c);
                          auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x140)
                                                      );
                          auVar172 = vmovdqu32_avx512f(auVar172);
                          *(undefined1 (*) [64])(local_880.ray + 0x440) = auVar172;
                          auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x180)
                                                      );
                          auVar172 = vmovdqu32_avx512f(auVar172);
                          *(undefined1 (*) [64])(local_880.ray + 0x480) = auVar172;
                          auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x1c0)
                                                      );
                          auVar172 = vmovdqa32_avx512f(auVar172);
                          *(undefined1 (*) [64])(local_880.ray + 0x4c0) = auVar172;
                          auVar172 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_880.hit + 0x200)
                                                      );
                          auVar172 = vmovdqa32_avx512f(auVar172);
                          *(undefined1 (*) [64])(local_880.ray + 0x500) = auVar172;
                          auVar237 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar93 = ~(byte)(1 << ((uint)uVar84 & 0x1f)) & (byte)uVar88;
                        uVar158 = auVar237._0_4_;
                        auVar168._4_4_ = uVar158;
                        auVar168._0_4_ = uVar158;
                        auVar168._8_4_ = uVar158;
                        auVar168._12_4_ = uVar158;
                        auVar168._16_4_ = uVar158;
                        auVar168._20_4_ = uVar158;
                        auVar168._24_4_ = uVar158;
                        auVar168._28_4_ = uVar158;
                        uVar32 = vcmpps_avx512vl(auVar238._0_32_,auVar168,2);
                        if ((bVar93 & (byte)uVar32) == 0) goto LAB_01ada1d2;
                        bVar93 = bVar93 & (byte)uVar32;
                        uVar88 = (ulong)bVar93;
                        auVar169._8_4_ = 0x7f800000;
                        auVar169._0_8_ = 0x7f8000007f800000;
                        auVar169._12_4_ = 0x7f800000;
                        auVar169._16_4_ = 0x7f800000;
                        auVar169._20_4_ = 0x7f800000;
                        auVar169._24_4_ = 0x7f800000;
                        auVar169._28_4_ = 0x7f800000;
                        auVar122 = vblendmps_avx512vl(auVar169,auVar238._0_32_);
                        auVar147._0_4_ =
                             (uint)(bVar93 & 1) * auVar122._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 1 & 1);
                        auVar147._4_4_ = (uint)bVar12 * auVar122._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 2 & 1);
                        auVar147._8_4_ = (uint)bVar12 * auVar122._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 3 & 1);
                        auVar147._12_4_ =
                             (uint)bVar12 * auVar122._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 4 & 1);
                        auVar147._16_4_ =
                             (uint)bVar12 * auVar122._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 5 & 1);
                        auVar147._20_4_ =
                             (uint)bVar12 * auVar122._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 6 & 1);
                        auVar147._24_4_ =
                             (uint)bVar12 * auVar122._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar147._28_4_ =
                             (uint)(bVar93 >> 7) * auVar122._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar122 = vshufps_avx(auVar147,auVar147,0xb1);
                        auVar122 = vminps_avx(auVar147,auVar122);
                        auVar123 = vshufpd_avx(auVar122,auVar122,5);
                        auVar122 = vminps_avx(auVar122,auVar123);
                        auVar123 = vpermpd_avx2(auVar122,0x4e);
                        auVar122 = vminps_avx(auVar122,auVar123);
                        uVar32 = vcmpps_avx512vl(auVar147,auVar122,0);
                        bVar83 = (byte)uVar32 & bVar93;
                        if (bVar83 != 0) {
                          bVar93 = bVar83;
                        }
                        uVar85 = 0;
                        for (uVar86 = (uint)bVar93; (uVar86 & 1) == 0;
                            uVar86 = uVar86 >> 1 | 0x80000000) {
                          uVar85 = uVar85 + 1;
                        }
                        uVar84 = (ulong)uVar85;
                      } while( true );
                    }
                    fVar179 = local_520[uVar84];
                    uVar158 = *(undefined4 *)(local_500 + uVar84 * 4);
                    fVar173 = 1.0 - fVar179;
                    auVar26 = vfnmadd231ss_fma(ZEXT416((uint)(fVar179 * (fVar173 + fVar173))),
                                               ZEXT416((uint)fVar173),ZEXT416((uint)fVar173));
                    auVar161 = ZEXT416((uint)fVar179);
                    auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                              ZEXT416(0xc0a00000));
                    auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179 * 3.0)),
                                               ZEXT416((uint)(fVar179 + fVar179)),auVar96);
                    auVar221 = ZEXT1664(auVar104);
                    auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                              ZEXT416(0x40000000));
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * -3.0)),
                                              ZEXT416((uint)(fVar173 + fVar173)),auVar96);
                    auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),auVar161,
                                               ZEXT416((uint)(fVar173 * -2.0)));
                    fVar173 = auVar26._0_4_ * 0.5;
                    fVar174 = auVar104._0_4_ * 0.5;
                    auVar209 = ZEXT464((uint)fVar174);
                    fVar175 = auVar96._0_4_ * 0.5;
                    fVar186 = auVar161._0_4_ * 0.5;
                    auVar193._0_4_ = fVar186 * local_8c0;
                    auVar193._4_4_ = fVar186 * fStack_8bc;
                    auVar193._8_4_ = fVar186 * fStack_8b8;
                    auVar193._12_4_ = fVar186 * fStack_8b4;
                    auVar212._4_4_ = fVar175;
                    auVar212._0_4_ = fVar175;
                    auVar212._8_4_ = fVar175;
                    auVar212._12_4_ = fVar175;
                    auVar96 = vfmadd132ps_fma(auVar212,auVar193,auVar27);
                    auVar215 = ZEXT1664(auVar96);
                    auVar194._4_4_ = fVar174;
                    auVar194._0_4_ = fVar174;
                    auVar194._8_4_ = fVar174;
                    auVar194._12_4_ = fVar174;
                    auVar96 = vfmadd132ps_fma(auVar194,auVar96,auVar28);
                    auVar183._4_4_ = fVar173;
                    auVar183._0_4_ = fVar173;
                    auVar183._8_4_ = fVar173;
                    auVar183._12_4_ = fVar173;
                    auVar96 = vfmadd213ps_fma(auVar183,auVar98,auVar96);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar84 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar96._0_4_;
                    uVar10 = vextractps_avx(auVar96,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar10;
                    uVar10 = vextractps_avx(auVar96,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar10;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar179;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar158;
                    *(uint *)(ray + k * 4 + 0x440) = uVar9;
                    *(uint *)(ray + k * 4 + 0x480) = uVar89;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01ad9dba;
      }
LAB_01ad9413:
      uVar158 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar36._4_4_ = uVar158;
      auVar36._0_4_ = uVar158;
      auVar36._8_4_ = uVar158;
      auVar36._12_4_ = uVar158;
      uVar31 = vcmpps_avx512vl(local_4b0,auVar36,2);
      uVar89 = (uint)uVar92 & (uint)uVar31;
      uVar92 = (ulong)uVar89;
    } while (uVar89 != 0);
  }
  return;
LAB_01ada1d2:
  auVar172 = ZEXT3264(local_7a0);
  auVar239 = ZEXT3264(local_7c0);
  auVar122 = vmovdqa64_avx512vl(local_3a0);
  auVar227 = ZEXT3264(auVar122);
  uVar92 = local_848;
  iVar87 = local_800._0_4_;
LAB_01ad9dba:
  lVar90 = lVar90 + 8;
  if (iVar87 <= (int)lVar90) goto LAB_01ad9413;
  goto LAB_01ad94b9;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }